

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void run_proper_context_tests(int use_prealloc)

{
  char cVar1;
  _func_void_char_ptr_void_ptr *p_Var2;
  int iVar3;
  int iVar4;
  secp256k1_context *psVar5;
  secp256k1_scalar *psVar6;
  size_t sVar7;
  secp256k1_context *b;
  secp256k1_context *psVar8;
  code *extraout_RAX;
  secp256k1_context *extraout_RAX_00;
  secp256k1_context *extraout_RAX_01;
  secp256k1_context *extraout_RAX_02;
  secp256k1_context *extraout_RAX_03;
  code *extraout_RAX_04;
  secp256k1_context *extraout_RAX_05;
  secp256k1_context *extraout_RAX_06;
  secp256k1_context *extraout_RAX_07;
  secp256k1_context *extraout_RAX_08;
  code *pcVar9;
  long lVar10;
  code *unaff_RBX;
  char *sigr_00;
  code *unaff_R14;
  secp256k1_context *unaff_R15;
  bool bVar11;
  int32_t dummy;
  secp256k1_ge pub;
  uchar seed [32];
  secp256k1_scalar sigs;
  secp256k1_scalar sigr;
  secp256k1_scalar msg;
  secp256k1_scalar nonce;
  secp256k1_scalar key;
  secp256k1_gej pubj;
  int iStackY_4c4;
  size_t sStackY_4c0;
  undefined1 auStackY_4b8 [8];
  secp256k1_pubkey *psStackY_4b0;
  uchar auStackY_4a8 [56];
  undefined8 uStackY_470;
  byte abStackY_468 [8];
  uchar auStackY_460 [16];
  undefined8 uStackY_450;
  byte abStackY_438 [48];
  undefined1 auStackY_408 [8];
  secp256k1_pubkey *psStackY_400;
  uchar auStackY_3f8 [40];
  uchar auStackY_3d0 [8];
  undefined1 auStackY_3c8 [16];
  undefined1 auStackY_3b8 [16];
  undefined1 auStackY_3a8 [16];
  undefined1 auStackY_398 [16];
  byte abStackY_388 [8];
  uchar auStackY_380 [24];
  undefined1 auStackY_368 [16];
  uchar auStackY_358 [8];
  uchar auStackY_350 [8];
  uchar auStackY_348 [8];
  uchar auStackY_340 [8];
  uchar auStackY_338 [8];
  uchar auStackY_330 [8];
  undefined8 uStackY_328;
  secp256k1_pubkey *psStackY_320;
  undefined8 uStackY_318;
  undefined8 uStackY_310;
  undefined8 uStackY_308;
  undefined8 uStackY_300;
  secp256k1_pubkey *psStackY_2f8;
  secp256k1_pubkey *psStackY_2f0;
  secp256k1_pubkey *psStackY_2e8;
  undefined1 auStackY_2d8 [16];
  uchar auStackY_2c8 [8];
  uchar auStackY_2c0 [8];
  uchar auStackY_2b8 [8];
  uchar auStackY_2b0 [8];
  uchar auStackY_2a8 [8];
  uchar auStackY_2a0 [8];
  ulong *puStackY_298;
  secp256k1_scalar *psStackY_290;
  secp256k1_context *psStackY_288;
  undefined1 auStackY_274 [20];
  ulong auStackY_260 [4];
  secp256k1_scalar *psStackY_240;
  secp256k1_context *psStackY_238;
  secp256k1_scalar *psStackY_230;
  secp256k1_context *psStackY_228;
  secp256k1_context *psStackY_220;
  undefined4 local_208;
  int local_204;
  secp256k1_context *local_200;
  secp256k1_scalar *local_1f8;
  secp256k1_ge local_1f0;
  uchar local_188 [32];
  secp256k1_scalar local_168;
  undefined1 local_148 [64];
  secp256k1_scalar local_108;
  secp256k1_scalar local_e8;
  secp256k1_gej local_c8;
  
  psVar8 = (secp256k1_context *)(ulong)(uint)use_prealloc;
  local_208 = 0;
  local_188[0x10] = '\0';
  local_188[0x11] = '\0';
  local_188[0x12] = '\0';
  local_188[0x13] = '\0';
  local_188[0x14] = '\0';
  local_188[0x15] = '\0';
  local_188[0x16] = '\0';
  local_188[0x17] = '\0';
  local_188[0x18] = '\0';
  local_188[0x19] = '\0';
  local_188[0x1a] = '\0';
  local_188[0x1b] = '\0';
  local_188[0x1c] = '\0';
  local_188[0x1d] = '\0';
  local_188[0x1e] = '\0';
  local_188[0x1f] = '\0';
  local_188[0] = '\x17';
  local_188[1] = '\0';
  local_188[2] = '\0';
  local_188[3] = '\0';
  local_188[4] = '\0';
  local_188[5] = '\0';
  local_188[6] = '\0';
  local_188[7] = '\0';
  local_188[8] = '\0';
  local_188[9] = '\0';
  local_188[10] = '\0';
  local_188[0xb] = '\0';
  local_188[0xc] = '\0';
  local_188[0xd] = '\0';
  local_188[0xe] = '\0';
  local_188[0xf] = '\0';
  psStackY_220 = (secp256k1_context *)0x13d019;
  psVar5 = secp256k1_context_create(1);
  if (use_prealloc == 0) {
    psStackY_220 = (secp256k1_context *)0x13d097;
    unaff_R15 = secp256k1_context_create(1);
    psVar6 = (secp256k1_scalar *)0x0;
LAB_0013d09d:
    psStackY_220 = (secp256k1_context *)0x13d0a8;
    iVar3 = context_eq(unaff_R15,psVar5);
    if (iVar3 == 0) {
      psStackY_220 = (secp256k1_context *)0x13d561;
      run_proper_context_tests_cold_28();
LAB_0013d561:
      psStackY_220 = (secp256k1_context *)0x13d566;
      run_proper_context_tests_cold_27();
LAB_0013d566:
      psStackY_220 = (secp256k1_context *)0x13d56b;
      run_proper_context_tests_cold_2();
LAB_0013d56b:
      psStackY_220 = (secp256k1_context *)0x13d570;
      run_proper_context_tests_cold_26();
LAB_0013d570:
      psStackY_220 = (secp256k1_context *)0x13d575;
      run_proper_context_tests_cold_25();
LAB_0013d575:
      psStackY_220 = (secp256k1_context *)0x13d57d;
      run_proper_context_tests_cold_3();
    }
    else {
      psStackY_220 = (secp256k1_context *)0x13d0c0;
      iVar3 = secp256k1_context_randomize(unaff_R15,local_188);
      if (iVar3 == 0) goto LAB_0013d561;
      psStackY_220 = (secp256k1_context *)0x13d0d3;
      iVar3 = context_eq(unaff_R15,psVar5);
      if (iVar3 != 0) goto LAB_0013d566;
      psStackY_220 = (secp256k1_context *)0x13d0e5;
      iVar3 = secp256k1_context_randomize(unaff_R15,(uchar *)0x0);
      if (iVar3 == 0) goto LAB_0013d56b;
      psStackY_220 = (secp256k1_context *)0x13d0f8;
      iVar3 = context_eq(unaff_R15,psVar5);
      if (iVar3 == 0) goto LAB_0013d570;
      if (secp256k1_context_static == unaff_R15) goto LAB_0013d575;
      (unaff_R15->error_callback).fn = secp256k1_default_illegal_callback_fn;
      (unaff_R15->error_callback).data = (void *)0x0;
    }
    p_Var2 = (unaff_R15->error_callback).fn;
    unaff_R14 = secp256k1_default_error_callback_fn;
    if (p_Var2 == secp256k1_default_error_callback_fn) {
      psStackY_220 = (secp256k1_context *)0x13d587;
      run_proper_context_tests_cold_24();
LAB_0013d587:
      psStackY_220 = (secp256k1_context *)0x13d58c;
      run_proper_context_tests_cold_4();
LAB_0013d58c:
      psStackY_220 = (secp256k1_context *)0x13d591;
      run_proper_context_tests_cold_5();
LAB_0013d591:
      psStackY_220 = (secp256k1_context *)0x13d596;
      run_proper_context_tests_cold_20();
LAB_0013d596:
      psStackY_220 = (secp256k1_context *)0x13d59b;
      run_proper_context_tests_cold_9();
LAB_0013d59b:
      psStackY_220 = (secp256k1_context *)0x13d5a3;
      run_proper_context_tests_cold_10();
LAB_0013d363:
      if ((unaff_R15->error_callback).fn == secp256k1_default_error_callback_fn) {
        psStackY_220 = (secp256k1_context *)0x13d37b;
        sigr_00 = (char *)unaff_R15;
        iVar3 = context_eq(unaff_R15,psVar5);
        if (iVar3 == 0) goto LAB_0013d5ad;
        if (secp256k1_context_static == unaff_R15) goto LAB_0013d5b2;
        (unaff_R15->illegal_callback).fn = counting_illegal_callback_fn;
        (unaff_R15->illegal_callback).data = &local_208;
      }
      else {
        psStackY_220 = (secp256k1_context *)0x13d5ad;
        run_proper_context_tests_cold_11();
LAB_0013d5ad:
        psStackY_220 = (secp256k1_context *)0x13d5b2;
        run_proper_context_tests_cold_19();
LAB_0013d5b2:
        sigr_00 = "ctx != secp256k1_context_static";
        psStackY_220 = (secp256k1_context *)0x13d5c7;
        (*(unaff_R15->illegal_callback).fn)
                  ("ctx != secp256k1_context_static",(unaff_R15->illegal_callback).data);
      }
      if ((unaff_R15->illegal_callback).fn == counting_illegal_callback_fn) {
        if ((undefined4 *)(unaff_R15->illegal_callback).data != &local_208) goto LAB_0013d5d1;
        pcVar9 = counting_illegal_callback_fn;
        if (secp256k1_context_static == unaff_R15) goto LAB_0013d5d6;
        (unaff_R15->illegal_callback).fn = unaff_RBX;
        (unaff_R15->illegal_callback).data = (void *)0x0;
      }
      else {
        psStackY_220 = (secp256k1_context *)0x13d5d1;
        run_proper_context_tests_cold_12();
LAB_0013d5d1:
        psStackY_220 = (secp256k1_context *)0x13d5d6;
        run_proper_context_tests_cold_13();
        pcVar9 = extraout_RAX;
LAB_0013d5d6:
        sigr_00 = "ctx != secp256k1_context_static";
        psStackY_220 = (secp256k1_context *)0x13d5df;
        (*pcVar9)();
      }
      if ((secp256k1_scalar *)(unaff_R15->illegal_callback).fn == (secp256k1_scalar *)unaff_RBX) {
        if ((unaff_R15->illegal_callback).data != (void *)0x0) goto LAB_0013d5e9;
        psStackY_220 = (secp256k1_context *)0x13d41b;
        sigr_00 = (char *)unaff_R15;
        iVar3 = context_eq(unaff_R15,psVar5);
        if (iVar3 == 0) goto LAB_0013d5ee;
        psVar8 = (secp256k1_context *)(local_148 + 0x20);
        psStackY_220 = (secp256k1_context *)0x13d43d;
        local_200 = psVar5;
        local_1f8 = psVar6;
        random_scalar_order_test((secp256k1_scalar *)psVar8);
        psStackY_220 = (secp256k1_context *)0x13d44d;
        random_scalar_order_test(&local_e8);
        psStackY_220 = (secp256k1_context *)0x13d463;
        secp256k1_ecmult_gen(&unaff_R15->ecmult_gen_ctx,&local_c8,&local_e8);
        psStackY_220 = (secp256k1_context *)0x13d470;
        secp256k1_ge_set_gej(&local_1f0,&local_c8);
        psVar5 = (secp256k1_context *)&local_108;
        unaff_R14 = (code *)local_148;
        unaff_RBX = (code *)&local_168;
        do {
          psStackY_220 = (secp256k1_context *)0x13d490;
          random_scalar_order_test((secp256k1_scalar *)psVar5);
          psStackY_220 = (secp256k1_context *)0x13d4af;
          iVar3 = secp256k1_ecdsa_sig_sign
                            (&unaff_R15->ecmult_gen_ctx,(secp256k1_scalar *)unaff_R14,
                             (secp256k1_scalar *)unaff_RBX,&local_e8,(secp256k1_scalar *)psVar8,
                             (secp256k1_scalar *)psVar5,(int *)0x0);
        } while (iVar3 == 0);
        psStackY_220 = (secp256k1_context *)0x13d4eb;
        sigr_00 = (char *)unaff_R15;
        iVar3 = secp256k1_ecdsa_sig_sign
                          (&unaff_R15->ecmult_gen_ctx,(secp256k1_scalar *)local_148,&local_168,
                           &local_e8,(secp256k1_scalar *)(local_148 + 0x20),&local_108,(int *)0x0);
        if (iVar3 == 0) goto LAB_0013d5f3;
        sigr_00 = local_148;
        psStackY_220 = (secp256k1_context *)0x13d515;
        iVar3 = secp256k1_ecdsa_sig_verify
                          ((secp256k1_scalar *)sigr_00,&local_168,&local_1f0,
                           (secp256k1_scalar *)(local_148 + 0x20));
        if (iVar3 != 0) {
          if (local_204 == 0) {
            psStackY_220 = (secp256k1_context *)0x13d540;
            secp256k1_context_destroy(unaff_R15);
          }
          else {
            psStackY_220 = (secp256k1_context *)0x13d52c;
            secp256k1_context_preallocated_destroy(unaff_R15);
            psStackY_220 = (secp256k1_context *)0x13d536;
            free(local_1f8);
          }
          psStackY_220 = (secp256k1_context *)0x13d54a;
          secp256k1_context_destroy(local_200);
          return;
        }
      }
      else {
        psStackY_220 = (secp256k1_context *)0x13d5e9;
        run_proper_context_tests_cold_14();
LAB_0013d5e9:
        psStackY_220 = (secp256k1_context *)0x13d5ee;
        run_proper_context_tests_cold_15();
LAB_0013d5ee:
        psStackY_220 = (secp256k1_context *)0x13d5f3;
        run_proper_context_tests_cold_18();
LAB_0013d5f3:
        psStackY_220 = (secp256k1_context *)0x13d5f8;
        run_proper_context_tests_cold_17();
      }
      psStackY_220 = (secp256k1_context *)0x13d5fd;
      run_proper_context_tests_cold_16();
      goto LAB_0013d5fd;
    }
    unaff_RBX = secp256k1_default_illegal_callback_fn;
    if (p_Var2 != secp256k1_default_illegal_callback_fn) goto LAB_0013d587;
    psStackY_220 = (secp256k1_context *)0x13d155;
    sVar7 = secp256k1_context_preallocated_clone_size(unaff_R15);
    local_c8.x.n[0] = 0x4d430002;
    local_c8.x.n[1] = 0;
    local_c8.x.n[2] = 0;
    local_c8.x.n[3] = 0;
    local_c8.x.n[4] = 0;
    local_c8.x.magnitude = 0;
    local_c8.x.normalized = 0;
    unaff_RBX = secp256k1_default_illegal_callback_fn;
    local_1f0.x.n[0] = 0;
    if (sVar7 != 0xe8) goto LAB_0013d58c;
    local_204 = use_prealloc;
    if (use_prealloc != 0) {
      psStackY_220 = (secp256k1_context *)0x13d1bf;
      b = secp256k1_context_clone(unaff_R15);
      psStackY_220 = (secp256k1_context *)0x13d1cd;
      sigr_00 = (char *)unaff_R15;
      iVar3 = context_eq(unaff_R15,b);
      psVar8 = b;
      if (iVar3 == 0) goto LAB_0013d602;
      psStackY_220 = (secp256k1_context *)0x13d1dd;
      secp256k1_context_preallocated_destroy(unaff_R15);
      psStackY_220 = (secp256k1_context *)0x13d1e5;
      free(psVar6);
      local_c8.x.n[0] = 0x4d430002;
      local_c8.x.n[1] = 0;
      local_c8.x.n[2] = 0;
      local_c8.x.n[3] = 0;
      local_c8.x.n[4] = 0;
      local_c8.x.magnitude = 0;
      local_c8.x.normalized = 0;
      unaff_RBX = secp256k1_default_illegal_callback_fn;
      local_1f0.x.n[0] = 0;
      sigr_00 = (char *)0xe8;
      psStackY_220 = (secp256k1_context *)0x13d233;
      psVar6 = (secp256k1_scalar *)malloc(0xe8);
      if (psVar6 == (secp256k1_scalar *)0x0) goto LAB_0013d607;
      psStackY_220 = (secp256k1_context *)0x13d24a;
      unaff_R15 = secp256k1_context_preallocated_clone(b,psVar6);
      psStackY_220 = (secp256k1_context *)0x13d258;
      sigr_00 = (char *)b;
      iVar3 = context_eq(b,unaff_R15);
      if (iVar3 != 0) {
        psStackY_220 = (secp256k1_context *)0x13d268;
        secp256k1_context_destroy(b);
        goto LAB_0013d32b;
      }
      goto LAB_0013d60c;
    }
    local_c8.x.n[0] = 0x4d430002;
    local_c8.x.n[1] = 0;
    local_c8.x.n[2] = 0;
    local_c8.x.n[3] = 0;
    local_c8.x.n[4] = 0;
    local_c8.x.magnitude = 0;
    local_c8.x.normalized = 0;
    local_1f0.x.n[0] = 0;
    sigr_00 = (char *)0xe8;
    psStackY_220 = (secp256k1_context *)0x13d2bb;
    b = (secp256k1_context *)malloc(0xe8);
    unaff_RBX = secp256k1_default_illegal_callback_fn;
    if (b == (secp256k1_context *)0x0) goto LAB_0013d611;
    psStackY_220 = (secp256k1_context *)0x13d2d5;
    psVar8 = secp256k1_context_preallocated_clone(unaff_R15,b);
    psStackY_220 = (secp256k1_context *)0x13d2e3;
    sigr_00 = (char *)unaff_R15;
    iVar3 = context_eq(unaff_R15,psVar8);
    if (iVar3 == 0) goto LAB_0013d616;
    psStackY_220 = (secp256k1_context *)0x13d2f3;
    secp256k1_context_destroy(unaff_R15);
    psStackY_220 = (secp256k1_context *)0x13d2fb;
    unaff_R15 = secp256k1_context_clone(psVar8);
    psStackY_220 = (secp256k1_context *)0x13d309;
    sigr_00 = (char *)psVar8;
    iVar3 = context_eq(psVar8,unaff_R15);
    if (iVar3 != 0) {
      psStackY_220 = (secp256k1_context *)0x13d319;
      secp256k1_context_preallocated_destroy(psVar8);
      psStackY_220 = (secp256k1_context *)0x13d321;
      free(b);
LAB_0013d32b:
      unaff_RBX = secp256k1_default_illegal_callback_fn;
      p_Var2 = (unaff_R15->error_callback).fn;
      psVar8 = b;
      if (p_Var2 == secp256k1_default_error_callback_fn) goto LAB_0013d591;
      if (p_Var2 != secp256k1_default_illegal_callback_fn) goto LAB_0013d596;
      if (secp256k1_context_static == unaff_R15) goto LAB_0013d59b;
      (unaff_R15->error_callback).fn = secp256k1_default_error_callback_fn;
      (unaff_R15->error_callback).data = (void *)0x0;
      goto LAB_0013d363;
    }
  }
  else {
    local_c8.x.n[0] = 0x4d430002;
    local_c8.x.n[1] = 0;
    local_c8.x.n[2] = 0;
    local_c8.x.n[3] = 0;
    local_c8.x.n[4] = 0;
    local_c8.x.magnitude = 0;
    local_c8.x.normalized = 0;
    local_1f0.x.n[0] = 0;
    sigr_00 = (char *)0xe8;
    psStackY_220 = (secp256k1_context *)0x13d06f;
    psVar6 = (secp256k1_scalar *)malloc(0xe8);
    if (psVar6 != (secp256k1_scalar *)0x0) {
      psStackY_220 = (secp256k1_context *)0x13d088;
      unaff_R15 = secp256k1_context_preallocated_create(psVar6,1);
      goto LAB_0013d09d;
    }
LAB_0013d5fd:
    psStackY_220 = (secp256k1_context *)0x13d602;
    run_proper_context_tests_cold_1();
LAB_0013d602:
    psStackY_220 = (secp256k1_context *)0x13d607;
    run_proper_context_tests_cold_8();
LAB_0013d607:
    psStackY_220 = (secp256k1_context *)0x13d60c;
    run_proper_context_tests_cold_7();
LAB_0013d60c:
    psStackY_220 = (secp256k1_context *)0x13d611;
    run_proper_context_tests_cold_6();
LAB_0013d611:
    b = psVar8;
    psVar6 = (secp256k1_scalar *)unaff_RBX;
    psStackY_220 = (secp256k1_context *)0x13d616;
    run_proper_context_tests_cold_23();
LAB_0013d616:
    psStackY_220 = (secp256k1_context *)0x13d61b;
    run_proper_context_tests_cold_22();
  }
  psStackY_220 = (secp256k1_context *)run_static_context_tests;
  run_proper_context_tests_cold_21();
  psVar8 = STATIC_CTX;
  psStackY_240 = psVar6;
  psStackY_238 = b;
  psStackY_230 = (secp256k1_scalar *)unaff_R14;
  psStackY_228 = unaff_R15;
  psStackY_220 = psVar5;
  if (secp256k1_context_no_precomp == secp256k1_context_static) {
    iVar3 = (int)sigr_00;
    auStackY_260[2] = 0;
    auStackY_260[3] = 0;
    auStackY_260[0] = 0x17;
    auStackY_260[1] = 0;
    auStackY_274._0_4_ = 0;
    auStackY_274._4_8_ = (STATIC_CTX->illegal_callback).fn;
    auStackY_274._12_8_ = (STATIC_CTX->illegal_callback).data;
    psVar5 = (secp256k1_context *)((ulong)sigr_00 & 0xffffffff);
    if (secp256k1_context_static == STATIC_CTX) goto LAB_0013da89;
    (STATIC_CTX->illegal_callback).fn = counting_illegal_callback_fn;
    (psVar8->illegal_callback).data = auStackY_274;
  }
  else {
    psStackY_288 = (secp256k1_context *)0x13da89;
    run_static_context_tests_cold_1();
    psVar8 = extraout_RAX_01;
LAB_0013da89:
    iVar3 = (int)psVar5;
    psStackY_288 = (secp256k1_context *)0x13da9d;
    (*(psVar8->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar8->illegal_callback).data);
  }
  psStackY_288 = (secp256k1_context *)0x13d6ac;
  iVar4 = secp256k1_context_randomize(STATIC_CTX,(uchar *)auStackY_260);
  psVar8 = STATIC_CTX;
  if (iVar4 == 0) {
    (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)auStackY_274._4_8_;
    (psVar8->illegal_callback).data = (void *)auStackY_274._12_8_;
    if (auStackY_274._0_4_ != 1) goto LAB_0013daa7;
    auStackY_274._0_4_ = 0;
    auStackY_274._4_8_ = (psVar8->illegal_callback).fn;
    auStackY_274._12_8_ = (psVar8->illegal_callback).data;
    if (secp256k1_context_static != psVar8) {
      (psVar8->illegal_callback).fn = counting_illegal_callback_fn;
      (psVar8->illegal_callback).data = auStackY_274;
      goto LAB_0013d710;
    }
  }
  else {
    psStackY_288 = (secp256k1_context *)0x13daa7;
    run_static_context_tests_cold_2();
LAB_0013daa7:
    psStackY_288 = (secp256k1_context *)0x13daac;
    run_static_context_tests_cold_3();
    psVar8 = extraout_RAX_02;
  }
  psStackY_288 = (secp256k1_context *)0x13dac0;
  (*(psVar8->illegal_callback).fn)
            ("ctx != secp256k1_context_static",(psVar8->illegal_callback).data);
LAB_0013d710:
  psStackY_288 = (secp256k1_context *)0x13d71e;
  iVar4 = secp256k1_context_randomize(STATIC_CTX,(uchar *)0x0);
  psVar8 = STATIC_CTX;
  if (iVar4 == 0) {
    (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)auStackY_274._4_8_;
    (psVar8->illegal_callback).data = (void *)auStackY_274._12_8_;
    if (auStackY_274._0_4_ == 1) {
      pcVar9 = (code *)&psVar8->illegal_callback;
      if (iVar3 == 0) goto LAB_0013d8f7;
      auStackY_274._0_4_ = 0;
      auStackY_274._4_8_ = ((secp256k1_callback *)pcVar9)->fn;
      auStackY_274._12_8_ = (psVar8->illegal_callback).data;
      if (secp256k1_context_static == psVar8) goto LAB_0013db0a;
      (psVar8->illegal_callback).fn = counting_illegal_callback_fn;
      pcVar9 = (code *)auStackY_274;
      (psVar8->illegal_callback).data = pcVar9;
      goto LAB_0013d78a;
    }
  }
  else {
    psStackY_288 = (secp256k1_context *)0x13daca;
    run_static_context_tests_cold_4();
  }
  psStackY_288 = (secp256k1_context *)0x13dacf;
  run_static_context_tests_cold_5();
  psVar8 = extraout_RAX_03;
LAB_0013dacf:
  psStackY_288 = (secp256k1_context *)0x13dae3;
  (*(psVar8->illegal_callback).fn)
            ("ctx != secp256k1_context_static",(psVar8->illegal_callback).data);
  do {
    psVar8 = STATIC_CTX;
    if ((STATIC_CTX->illegal_callback).fn == counting_illegal_callback_fn) {
      if ((ulong *)(STATIC_CTX->illegal_callback).data != auStackY_260) goto LAB_0013daed;
      pcVar9 = counting_illegal_callback_fn;
      if (secp256k1_context_static == STATIC_CTX) goto LAB_0013daf2;
      (STATIC_CTX->illegal_callback).fn = secp256k1_default_illegal_callback_fn;
      (psVar8->illegal_callback).data = (void *)0x0;
    }
    else {
      psStackY_288 = (secp256k1_context *)0x13daed;
      run_static_context_tests_cold_16();
LAB_0013daed:
      psStackY_288 = (secp256k1_context *)0x13daf2;
      run_static_context_tests_cold_17();
      pcVar9 = extraout_RAX_04;
LAB_0013daf2:
      psStackY_288 = (secp256k1_context *)0x13dafb;
      (*pcVar9)("ctx != secp256k1_context_static");
    }
    pcVar9 = secp256k1_default_illegal_callback_fn;
    if ((STATIC_CTX->illegal_callback).fn == secp256k1_default_illegal_callback_fn) {
      if ((STATIC_CTX->illegal_callback).data == (void *)0x0) {
        return;
      }
    }
    else {
      psStackY_288 = (secp256k1_context *)0x13db05;
      run_static_context_tests_cold_18();
    }
    psStackY_288 = (secp256k1_context *)0x13db0a;
    run_static_context_tests_cold_19();
    psVar8 = extraout_RAX_05;
LAB_0013db0a:
    psStackY_288 = (secp256k1_context *)0x13db1e;
    (*(psVar8->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar8->illegal_callback).data);
LAB_0013d78a:
    psStackY_288 = (secp256k1_context *)0x13d796;
    sVar7 = secp256k1_context_preallocated_clone_size(STATIC_CTX);
    psVar8 = STATIC_CTX;
    if (sVar7 == 0) {
      (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)auStackY_274._4_8_;
      (psVar8->illegal_callback).data = (void *)auStackY_274._12_8_;
      unaff_R15 = psVar8;
      if (auStackY_274._0_4_ != 1) goto LAB_0013db28;
      psStackY_288 = (secp256k1_context *)0x13d7c8;
      psVar6 = (secp256k1_scalar *)malloc(0xe8);
      if (psVar6 == (secp256k1_scalar *)0x0) goto LAB_0013db2d;
      psStackY_288 = (secp256k1_context *)0x13d7ed;
      memset(psVar6,0x2a,0xe8);
      auStackY_274._0_4_ = 0;
      auStackY_274._4_8_ = (psVar8->illegal_callback).fn;
      auStackY_274._12_8_ = (psVar8->illegal_callback).data;
      unaff_R14 = (code *)psVar6;
      if (secp256k1_context_static == psVar8) goto LAB_0013db32;
      (psVar8->illegal_callback).fn = counting_illegal_callback_fn;
      (psVar8->illegal_callback).data = auStackY_274;
    }
    else {
      psStackY_288 = (secp256k1_context *)0x13db28;
      run_static_context_tests_cold_6();
LAB_0013db28:
      psStackY_288 = (secp256k1_context *)0x13db2d;
      run_static_context_tests_cold_7();
LAB_0013db2d:
      psStackY_288 = (secp256k1_context *)0x13db32;
      run_static_context_tests_cold_12();
LAB_0013db32:
      psStackY_288 = (secp256k1_context *)0x13db47;
      (*(unaff_R15->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(unaff_R15->illegal_callback).data);
    }
    psStackY_288 = (secp256k1_context *)0x13d835;
    psVar5 = secp256k1_context_preallocated_clone(STATIC_CTX,unaff_R14);
    psVar8 = STATIC_CTX;
    if (psVar5 == (secp256k1_context *)0x0) {
      (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)auStackY_274._4_8_;
      (psVar8->illegal_callback).data = (void *)auStackY_274._12_8_;
      unaff_R15 = psVar8;
      if (auStackY_274._0_4_ != 1) goto LAB_0013db51;
      lVar10 = 0;
      do {
        cVar1 = *(char *)((long)((secp256k1_scalar *)unaff_R14)->d + lVar10);
        pcVar9 = (code *)CONCAT71((int7)((ulong)pcVar9 >> 8),cVar1);
        if (cVar1 != '*') break;
        bVar11 = lVar10 != 0xe7;
        lVar10 = lVar10 + 1;
      } while (bVar11);
      if (cVar1 != '*') goto LAB_0013db56;
      psStackY_288 = (secp256k1_context *)0x13d88f;
      free(unaff_R14);
      auStackY_274._0_4_ = 0;
      auStackY_274._4_8_ = (psVar8->illegal_callback).fn;
      auStackY_274._12_8_ = (psVar8->illegal_callback).data;
      if (secp256k1_context_static == psVar8) goto LAB_0013db5b;
      (psVar8->illegal_callback).fn = counting_illegal_callback_fn;
      (psVar8->illegal_callback).data = auStackY_274;
    }
    else {
      psStackY_288 = (secp256k1_context *)0x13db51;
      run_static_context_tests_cold_8();
LAB_0013db51:
      psStackY_288 = (secp256k1_context *)0x13db56;
      run_static_context_tests_cold_9();
LAB_0013db56:
      psStackY_288 = (secp256k1_context *)0x13db5b;
      run_static_context_tests_cold_11();
LAB_0013db5b:
      psStackY_288 = (secp256k1_context *)0x13db70;
      (*(unaff_R15->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(unaff_R15->illegal_callback).data);
    }
    psStackY_288 = (secp256k1_context *)0x13d8d4;
    secp256k1_context_preallocated_destroy(STATIC_CTX);
    psVar8 = STATIC_CTX;
    (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)auStackY_274._4_8_;
    (psVar8->illegal_callback).data = (void *)auStackY_274._12_8_;
    if (auStackY_274._0_4_ != 1) {
      psStackY_288 = (secp256k1_context *)0x13d8f7;
      run_static_context_tests_cold_10();
      psVar8 = extraout_RAX_00;
LAB_0013d8f7:
      auStackY_274._0_4_ = 0;
      auStackY_274._4_8_ = ((secp256k1_callback *)pcVar9)->fn;
      auStackY_274._12_8_ = ((secp256k1_callback *)pcVar9)->data;
      if (secp256k1_context_static == psVar8) {
        psStackY_288 = (secp256k1_context *)0x13db89;
        (*(psVar8->illegal_callback).fn)
                  ("ctx != secp256k1_context_static",(psVar8->illegal_callback).data);
      }
      else {
        (psVar8->illegal_callback).fn = counting_illegal_callback_fn;
        (psVar8->illegal_callback).data = auStackY_274;
      }
      psStackY_288 = (secp256k1_context *)0x13d93a;
      psVar5 = secp256k1_context_clone(STATIC_CTX);
      psVar8 = STATIC_CTX;
      if (psVar5 == (secp256k1_context *)0x0) {
        (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)auStackY_274._4_8_;
        (psVar8->illegal_callback).data = (void *)auStackY_274._12_8_;
        if (auStackY_274._0_4_ != 1) goto LAB_0013db93;
        auStackY_274._0_4_ = 0;
        auStackY_274._4_8_ = (psVar8->illegal_callback).fn;
        auStackY_274._12_8_ = (psVar8->illegal_callback).data;
        if (secp256k1_context_static == psVar8) goto LAB_0013db98;
        (psVar8->illegal_callback).fn = counting_illegal_callback_fn;
        (psVar8->illegal_callback).data = auStackY_274;
      }
      else {
        psStackY_288 = (secp256k1_context *)0x13db93;
        run_static_context_tests_cold_13();
LAB_0013db93:
        psStackY_288 = (secp256k1_context *)0x13db98;
        run_static_context_tests_cold_14();
        psVar8 = extraout_RAX_06;
LAB_0013db98:
        psStackY_288 = (secp256k1_context *)0x13dbac;
        (*(psVar8->illegal_callback).fn)
                  ("ctx != secp256k1_context_static",(psVar8->illegal_callback).data);
      }
      psStackY_288 = (secp256k1_context *)0x13d9ab;
      secp256k1_context_destroy(STATIC_CTX);
      psVar8 = STATIC_CTX;
      (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)auStackY_274._4_8_;
      (psVar8->illegal_callback).data = (void *)auStackY_274._12_8_;
      if (auStackY_274._0_4_ != 1) {
        psStackY_288 = (secp256k1_context *)run_eckey_edge_case_test;
        run_static_context_tests_cold_15();
        auStackY_380[8] = 0xba;
        auStackY_380[9] = 0xae;
        auStackY_380[10] = 0xdc;
        auStackY_380[0xb] = 0xe6;
        auStackY_380[0xc] = 0xaf;
        auStackY_380[0xd] = 'H';
        auStackY_380[0xe] = 0xa0;
        auStackY_380[0xf] = ';';
        auStackY_380[0x10] = 0xbf;
        auStackY_380[0x11] = 0xd2;
        auStackY_380[0x12] = '^';
        auStackY_380[0x13] = 0x8c;
        auStackY_380[0x14] = 0xd0;
        auStackY_380[0x15] = '6';
        auStackY_380[0x16] = 'A';
        auStackY_380[0x17] = 'A';
        abStackY_388[0] = 0xff;
        abStackY_388[1] = 0xff;
        abStackY_388[2] = 0xff;
        abStackY_388[3] = 0xff;
        abStackY_388[4] = 0xff;
        abStackY_388[5] = 0xff;
        abStackY_388[6] = 0xff;
        abStackY_388[7] = 0xff;
        auStackY_380[0] = 0xff;
        auStackY_380[1] = 0xff;
        auStackY_380[2] = 0xff;
        auStackY_380[3] = 0xff;
        auStackY_380[4] = 0xff;
        auStackY_380[5] = 0xff;
        auStackY_380[6] = 0xff;
        auStackY_380[7] = 0xfe;
        auStackY_398 = (undefined1  [16])0x0;
        auStackY_3a8 = (undefined1  [16])0x0;
        auStackY_3b8 = (undefined1  [16])0x0;
        auStackY_3c8 = (undefined1  [16])0x0;
        puStackY_298 = auStackY_260;
        psStackY_290 = (secp256k1_scalar *)unaff_R14;
        psStackY_288 = unaff_R15;
        iVar3 = secp256k1_ec_seckey_verify(CTX,abStackY_388);
        if (iVar3 == 0) {
          auStackY_408[0] = '\x01';
          auStackY_408[1] = '\0';
          auStackY_408[2] = 'C';
          auStackY_408[3] = 'M';
          auStackY_408[4] = '\0';
          auStackY_408[5] = '\0';
          auStackY_408[6] = '\0';
          auStackY_408[7] = '\0';
          auStackY_3f8[0] = '@';
          auStackY_3f8[1] = '\0';
          auStackY_3f8[2] = '\0';
          auStackY_3f8[3] = '\0';
          auStackY_3f8[4] = '\0';
          auStackY_3f8[5] = '\0';
          auStackY_3f8[6] = '\0';
          auStackY_3f8[7] = '\0';
          auStackY_3f8[8] = '\0';
          auStackY_3f8[9] = '\0';
          auStackY_3f8[10] = '\0';
          auStackY_3f8[0xb] = '\0';
          auStackY_3f8[0xc] = '\0';
          auStackY_3f8[0xd] = '\0';
          auStackY_3f8[0xe] = '\0';
          auStackY_3f8[0xf] = '\0';
          auStackY_3f8[0x10] = '\0';
          auStackY_3f8[0x11] = '\0';
          auStackY_3f8[0x12] = '\0';
          auStackY_3f8[0x13] = '\0';
          auStackY_3f8[0x14] = '\0';
          auStackY_3f8[0x15] = '\0';
          auStackY_3f8[0x16] = '\0';
          auStackY_3f8[0x17] = '\0';
          auStackY_3f8[0x18] = '\0';
          auStackY_3f8[0x19] = '\0';
          auStackY_3f8[0x1a] = '\0';
          auStackY_3f8[0x1b] = '\0';
          auStackY_3f8[0x1c] = '\0';
          auStackY_3f8[0x1d] = '\0';
          auStackY_3f8[0x1e] = '\0';
          auStackY_3f8[0x1f] = '\0';
          auStackY_368[0] = '\0';
          auStackY_368[1] = '\0';
          auStackY_368[2] = '\0';
          auStackY_368[3] = '\0';
          auStackY_368[4] = '\0';
          auStackY_368[5] = '\0';
          auStackY_368[6] = '\0';
          auStackY_368[7] = '\0';
          psStackY_400 = (secp256k1_pubkey *)auStackY_4b8;
          iVar3 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)auStackY_4b8,abStackY_388);
          if (iVar3 == 0) {
            auStackY_408[0] = '\x05';
            auStackY_408[1] = '\0';
            auStackY_408[2] = 'C';
            auStackY_408[3] = 'M';
            auStackY_408[4] = '\0';
            auStackY_408[5] = '\0';
            auStackY_408[6] = '\0';
            auStackY_408[7] = '\0';
            psStackY_400 = (secp256k1_pubkey *)auStackY_4b8;
            auStackY_3f8[0] = '@';
            auStackY_3f8[1] = '\0';
            auStackY_3f8[2] = '\0';
            auStackY_3f8[3] = '\0';
            auStackY_3f8[4] = '\0';
            auStackY_3f8[5] = '\0';
            auStackY_3f8[6] = '\0';
            auStackY_3f8[7] = '\0';
            lVar10 = 0;
            auStackY_3f8[8] = '\0';
            auStackY_3f8[9] = '\0';
            auStackY_3f8[10] = '\0';
            auStackY_3f8[0xb] = '\0';
            auStackY_3f8[0xc] = '\0';
            auStackY_3f8[0xd] = '\0';
            auStackY_3f8[0xe] = '\0';
            auStackY_3f8[0xf] = '\0';
            auStackY_3f8[0x10] = '\0';
            auStackY_3f8[0x11] = '\0';
            auStackY_3f8[0x12] = '\0';
            auStackY_3f8[0x13] = '\0';
            auStackY_3f8[0x14] = '\0';
            auStackY_3f8[0x15] = '\0';
            auStackY_3f8[0x16] = '\0';
            auStackY_3f8[0x17] = '\0';
            auStackY_3f8[0x18] = '\0';
            auStackY_3f8[0x19] = '\0';
            auStackY_3f8[0x1a] = '\0';
            auStackY_3f8[0x1b] = '\0';
            auStackY_3f8[0x1c] = '\0';
            auStackY_3f8[0x1d] = '\0';
            auStackY_3f8[0x1e] = '\0';
            auStackY_3f8[0x1f] = '\0';
            auStackY_368[0] = '\0';
            auStackY_368[1] = '\0';
            auStackY_368[2] = '\0';
            auStackY_368[3] = '\0';
            auStackY_368[4] = '\0';
            auStackY_368[5] = '\0';
            auStackY_368[6] = '\0';
            auStackY_368[7] = '\0';
            break;
          }
        }
        else {
          run_eckey_edge_case_test_cold_1();
        }
        run_eckey_edge_case_test_cold_2();
        goto LAB_0013f6dd;
      }
    }
    psVar8 = STATIC_CTX;
    auStackY_260[0] = auStackY_260[0] & 0xffffffff00000000;
    if (secp256k1_context_static == STATIC_CTX) goto LAB_0013dacf;
    (STATIC_CTX->illegal_callback).fn = counting_illegal_callback_fn;
    (psVar8->illegal_callback).data = auStackY_260;
  } while( true );
  while (lVar10 = lVar10 + 1, lVar10 != 0x40) {
    iVar3 = (uint)(byte)auStackY_4b8[lVar10] - (uint)(byte)auStackY_3c8[lVar10];
    if (auStackY_4b8[lVar10] != auStackY_3c8[lVar10]) goto LAB_0013dd03;
  }
  iVar3 = 0;
LAB_0013dd03:
  if (iVar3 == 0) {
    auStackY_460[8] = 0xff;
    auStackY_460[9] = 0xff;
    auStackY_460[10] = 0xff;
    auStackY_460[0xb] = 0xff;
    auStackY_460[0xc] = 0xff;
    auStackY_460[0xd] = 0xff;
    auStackY_460[0xe] = 0xff;
    auStackY_460[0xf] = 0xff;
    uStackY_450._0_1_ = 0xff;
    uStackY_450._1_1_ = 0xff;
    uStackY_450._2_1_ = 0xff;
    uStackY_450._3_1_ = 0xff;
    uStackY_450._4_1_ = 0xff;
    uStackY_450._5_1_ = 0xff;
    uStackY_450._6_1_ = 0xff;
    uStackY_450._7_1_ = 0xff;
    abStackY_468[0] = 0xff;
    abStackY_468[1] = 0xff;
    abStackY_468[2] = 0xff;
    abStackY_468[3] = 0xff;
    abStackY_468[4] = 0xff;
    abStackY_468[5] = 0xff;
    abStackY_468[6] = 0xff;
    abStackY_468[7] = 0xff;
    auStackY_460[0] = 0xff;
    auStackY_460[1] = 0xff;
    auStackY_460[2] = 0xff;
    auStackY_460[3] = 0xff;
    auStackY_460[4] = 0xff;
    auStackY_460[5] = 0xff;
    auStackY_460[6] = 0xff;
    auStackY_460[7] = 0xff;
    iVar3 = secp256k1_ec_seckey_verify(CTX,abStackY_468);
    if (iVar3 != 0) goto LAB_0013f6e2;
    builtin_memcpy(auStackY_4a8 + 0x20,
                   "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
    builtin_memcpy(auStackY_4a8 + 0x10,
                   "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
    builtin_memcpy(auStackY_4a8,"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",
                   0x10);
    auStackY_4b8[0] = '\x01';
    auStackY_4b8[1] = '\x01';
    auStackY_4b8[2] = '\x01';
    auStackY_4b8[3] = '\x01';
    auStackY_4b8[4] = '\x01';
    auStackY_4b8[5] = '\x01';
    auStackY_4b8[6] = '\x01';
    auStackY_4b8[7] = '\x01';
    psStackY_4b0 = (secp256k1_pubkey *)0x101010101010101;
    auStackY_408[0] = '\x01';
    auStackY_408[1] = '\0';
    auStackY_408[2] = 'C';
    auStackY_408[3] = 'M';
    auStackY_408[4] = '\0';
    auStackY_408[5] = '\0';
    auStackY_408[6] = '\0';
    auStackY_408[7] = '\0';
    auStackY_3f8[0] = '@';
    auStackY_3f8[1] = '\0';
    auStackY_3f8[2] = '\0';
    auStackY_3f8[3] = '\0';
    auStackY_3f8[4] = '\0';
    auStackY_3f8[5] = '\0';
    auStackY_3f8[6] = '\0';
    auStackY_3f8[7] = '\0';
    auStackY_3f8[8] = '\0';
    auStackY_3f8[9] = '\0';
    auStackY_3f8[10] = '\0';
    auStackY_3f8[0xb] = '\0';
    auStackY_3f8[0xc] = '\0';
    auStackY_3f8[0xd] = '\0';
    auStackY_3f8[0xe] = '\0';
    auStackY_3f8[0xf] = '\0';
    auStackY_3f8[0x10] = '\0';
    auStackY_3f8[0x11] = '\0';
    auStackY_3f8[0x12] = '\0';
    auStackY_3f8[0x13] = '\0';
    auStackY_3f8[0x14] = '\0';
    auStackY_3f8[0x15] = '\0';
    auStackY_3f8[0x16] = '\0';
    auStackY_3f8[0x17] = '\0';
    auStackY_3f8[0x18] = '\0';
    auStackY_3f8[0x19] = '\0';
    auStackY_3f8[0x1a] = '\0';
    auStackY_3f8[0x1b] = '\0';
    auStackY_3f8[0x1c] = '\0';
    auStackY_3f8[0x1d] = '\0';
    auStackY_3f8[0x1e] = '\0';
    auStackY_3f8[0x1f] = '\0';
    auStackY_368[0] = '\0';
    auStackY_368[1] = '\0';
    auStackY_368[2] = '\0';
    auStackY_368[3] = '\0';
    auStackY_368[4] = '\0';
    auStackY_368[5] = '\0';
    auStackY_368[6] = '\0';
    auStackY_368[7] = '\0';
    psStackY_400 = (secp256k1_pubkey *)auStackY_4b8;
    iVar3 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)auStackY_4b8,abStackY_468);
    if (iVar3 != 0) goto LAB_0013f6e7;
    auStackY_408[0] = '\x05';
    auStackY_408[1] = '\0';
    auStackY_408[2] = 'C';
    auStackY_408[3] = 'M';
    auStackY_408[4] = '\0';
    auStackY_408[5] = '\0';
    auStackY_408[6] = '\0';
    auStackY_408[7] = '\0';
    psStackY_400 = (secp256k1_pubkey *)auStackY_4b8;
    auStackY_3f8[0] = '@';
    auStackY_3f8[1] = '\0';
    auStackY_3f8[2] = '\0';
    auStackY_3f8[3] = '\0';
    auStackY_3f8[4] = '\0';
    auStackY_3f8[5] = '\0';
    auStackY_3f8[6] = '\0';
    auStackY_3f8[7] = '\0';
    lVar10 = 0;
    auStackY_3f8[8] = '\0';
    auStackY_3f8[9] = '\0';
    auStackY_3f8[10] = '\0';
    auStackY_3f8[0xb] = '\0';
    auStackY_3f8[0xc] = '\0';
    auStackY_3f8[0xd] = '\0';
    auStackY_3f8[0xe] = '\0';
    auStackY_3f8[0xf] = '\0';
    auStackY_3f8[0x10] = '\0';
    auStackY_3f8[0x11] = '\0';
    auStackY_3f8[0x12] = '\0';
    auStackY_3f8[0x13] = '\0';
    auStackY_3f8[0x14] = '\0';
    auStackY_3f8[0x15] = '\0';
    auStackY_3f8[0x16] = '\0';
    auStackY_3f8[0x17] = '\0';
    auStackY_3f8[0x18] = '\0';
    auStackY_3f8[0x19] = '\0';
    auStackY_3f8[0x1a] = '\0';
    auStackY_3f8[0x1b] = '\0';
    auStackY_3f8[0x1c] = '\0';
    auStackY_3f8[0x1d] = '\0';
    auStackY_3f8[0x1e] = '\0';
    auStackY_3f8[0x1f] = '\0';
    auStackY_368[0] = '\0';
    auStackY_368[1] = '\0';
    auStackY_368[2] = '\0';
    auStackY_368[3] = '\0';
    auStackY_368[4] = '\0';
    auStackY_368[5] = '\0';
    auStackY_368[6] = '\0';
    auStackY_368[7] = '\0';
    do {
      iVar3 = (uint)(byte)auStackY_4b8[lVar10] - (uint)(byte)auStackY_3c8[lVar10];
      if (auStackY_4b8[lVar10] != auStackY_3c8[lVar10]) goto LAB_0013de2a;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x40);
    iVar3 = 0;
LAB_0013de2a:
    if (iVar3 != 0) goto LAB_0013f6ec;
    auStackY_460[8] = '\0';
    auStackY_460[9] = '\0';
    auStackY_460[10] = '\0';
    auStackY_460[0xb] = '\0';
    auStackY_460[0xc] = '\0';
    auStackY_460[0xd] = '\0';
    auStackY_460[0xe] = '\0';
    auStackY_460[0xf] = '\0';
    uStackY_450._0_1_ = '\0';
    uStackY_450._1_1_ = '\0';
    uStackY_450._2_1_ = '\0';
    uStackY_450._3_1_ = '\0';
    uStackY_450._4_1_ = '\0';
    uStackY_450._5_1_ = '\0';
    uStackY_450._6_1_ = '\0';
    uStackY_450._7_1_ = '\0';
    abStackY_468[0] = '\0';
    abStackY_468[1] = '\0';
    abStackY_468[2] = '\0';
    abStackY_468[3] = '\0';
    abStackY_468[4] = '\0';
    abStackY_468[5] = '\0';
    abStackY_468[6] = '\0';
    abStackY_468[7] = '\0';
    auStackY_460[0] = '\0';
    auStackY_460[1] = '\0';
    auStackY_460[2] = '\0';
    auStackY_460[3] = '\0';
    auStackY_460[4] = '\0';
    auStackY_460[5] = '\0';
    auStackY_460[6] = '\0';
    auStackY_460[7] = '\0';
    iVar3 = secp256k1_ec_seckey_verify(CTX,abStackY_468);
    if (iVar3 != 0) goto LAB_0013f6f1;
    builtin_memcpy(auStackY_4a8 + 0x20,
                   "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
    builtin_memcpy(auStackY_4a8 + 0x10,
                   "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
    builtin_memcpy(auStackY_4a8,"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",
                   0x10);
    auStackY_4b8[0] = '\x01';
    auStackY_4b8[1] = '\x01';
    auStackY_4b8[2] = '\x01';
    auStackY_4b8[3] = '\x01';
    auStackY_4b8[4] = '\x01';
    auStackY_4b8[5] = '\x01';
    auStackY_4b8[6] = '\x01';
    auStackY_4b8[7] = '\x01';
    psStackY_4b0 = (secp256k1_pubkey *)0x101010101010101;
    auStackY_408[0] = '\x01';
    auStackY_408[1] = '\0';
    auStackY_408[2] = 'C';
    auStackY_408[3] = 'M';
    auStackY_408[4] = '\0';
    auStackY_408[5] = '\0';
    auStackY_408[6] = '\0';
    auStackY_408[7] = '\0';
    auStackY_3f8[0] = '@';
    auStackY_3f8[1] = '\0';
    auStackY_3f8[2] = '\0';
    auStackY_3f8[3] = '\0';
    auStackY_3f8[4] = '\0';
    auStackY_3f8[5] = '\0';
    auStackY_3f8[6] = '\0';
    auStackY_3f8[7] = '\0';
    auStackY_3f8[8] = '\0';
    auStackY_3f8[9] = '\0';
    auStackY_3f8[10] = '\0';
    auStackY_3f8[0xb] = '\0';
    auStackY_3f8[0xc] = '\0';
    auStackY_3f8[0xd] = '\0';
    auStackY_3f8[0xe] = '\0';
    auStackY_3f8[0xf] = '\0';
    auStackY_3f8[0x10] = '\0';
    auStackY_3f8[0x11] = '\0';
    auStackY_3f8[0x12] = '\0';
    auStackY_3f8[0x13] = '\0';
    auStackY_3f8[0x14] = '\0';
    auStackY_3f8[0x15] = '\0';
    auStackY_3f8[0x16] = '\0';
    auStackY_3f8[0x17] = '\0';
    auStackY_3f8[0x18] = '\0';
    auStackY_3f8[0x19] = '\0';
    auStackY_3f8[0x1a] = '\0';
    auStackY_3f8[0x1b] = '\0';
    auStackY_3f8[0x1c] = '\0';
    auStackY_3f8[0x1d] = '\0';
    auStackY_3f8[0x1e] = '\0';
    auStackY_3f8[0x1f] = '\0';
    auStackY_368[0] = '\0';
    auStackY_368[1] = '\0';
    auStackY_368[2] = '\0';
    auStackY_368[3] = '\0';
    auStackY_368[4] = '\0';
    auStackY_368[5] = '\0';
    auStackY_368[6] = '\0';
    auStackY_368[7] = '\0';
    psStackY_400 = (secp256k1_pubkey *)auStackY_4b8;
    iVar3 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)auStackY_4b8,abStackY_468);
    if (iVar3 != 0) goto LAB_0013f6f6;
    auStackY_408[0] = '\x05';
    auStackY_408[1] = '\0';
    auStackY_408[2] = 'C';
    auStackY_408[3] = 'M';
    auStackY_408[4] = '\0';
    auStackY_408[5] = '\0';
    auStackY_408[6] = '\0';
    auStackY_408[7] = '\0';
    psStackY_400 = (secp256k1_pubkey *)auStackY_4b8;
    auStackY_3f8[0] = '@';
    auStackY_3f8[1] = '\0';
    auStackY_3f8[2] = '\0';
    auStackY_3f8[3] = '\0';
    auStackY_3f8[4] = '\0';
    auStackY_3f8[5] = '\0';
    auStackY_3f8[6] = '\0';
    auStackY_3f8[7] = '\0';
    lVar10 = 0;
    auStackY_3f8[8] = '\0';
    auStackY_3f8[9] = '\0';
    auStackY_3f8[10] = '\0';
    auStackY_3f8[0xb] = '\0';
    auStackY_3f8[0xc] = '\0';
    auStackY_3f8[0xd] = '\0';
    auStackY_3f8[0xe] = '\0';
    auStackY_3f8[0xf] = '\0';
    auStackY_3f8[0x10] = '\0';
    auStackY_3f8[0x11] = '\0';
    auStackY_3f8[0x12] = '\0';
    auStackY_3f8[0x13] = '\0';
    auStackY_3f8[0x14] = '\0';
    auStackY_3f8[0x15] = '\0';
    auStackY_3f8[0x16] = '\0';
    auStackY_3f8[0x17] = '\0';
    auStackY_3f8[0x18] = '\0';
    auStackY_3f8[0x19] = '\0';
    auStackY_3f8[0x1a] = '\0';
    auStackY_3f8[0x1b] = '\0';
    auStackY_3f8[0x1c] = '\0';
    auStackY_3f8[0x1d] = '\0';
    auStackY_3f8[0x1e] = '\0';
    auStackY_3f8[0x1f] = '\0';
    auStackY_368[0] = '\0';
    auStackY_368[1] = '\0';
    auStackY_368[2] = '\0';
    auStackY_368[3] = '\0';
    auStackY_368[4] = '\0';
    auStackY_368[5] = '\0';
    auStackY_368[6] = '\0';
    auStackY_368[7] = '\0';
    do {
      iVar3 = (uint)(byte)auStackY_4b8[lVar10] - (uint)(byte)auStackY_3c8[lVar10];
      if (auStackY_4b8[lVar10] != auStackY_3c8[lVar10]) goto LAB_0013df4e;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x40);
    iVar3 = 0;
LAB_0013df4e:
    if (iVar3 != 0) goto LAB_0013f6fb;
    uStackY_450._7_1_ = '\x01';
    iVar3 = secp256k1_ec_seckey_verify(CTX,abStackY_468);
    if (iVar3 == 0) goto LAB_0013f700;
    auStackY_4a8[0x20] = '\0';
    auStackY_4a8[0x21] = '\0';
    auStackY_4a8[0x22] = '\0';
    auStackY_4a8[0x23] = '\0';
    auStackY_4a8[0x24] = '\0';
    auStackY_4a8[0x25] = '\0';
    auStackY_4a8[0x26] = '\0';
    auStackY_4a8[0x27] = '\0';
    auStackY_4a8[0x28] = '\0';
    auStackY_4a8[0x29] = '\0';
    auStackY_4a8[0x2a] = '\0';
    auStackY_4a8[0x2b] = '\0';
    auStackY_4a8[0x2c] = '\0';
    auStackY_4a8[0x2d] = '\0';
    auStackY_4a8[0x2e] = '\0';
    auStackY_4a8[0x2f] = '\0';
    auStackY_4a8[0x10] = '\0';
    auStackY_4a8[0x11] = '\0';
    auStackY_4a8[0x12] = '\0';
    auStackY_4a8[0x13] = '\0';
    auStackY_4a8[0x14] = '\0';
    auStackY_4a8[0x15] = '\0';
    auStackY_4a8[0x16] = '\0';
    auStackY_4a8[0x17] = '\0';
    auStackY_4a8[0x18] = '\0';
    auStackY_4a8[0x19] = '\0';
    auStackY_4a8[0x1a] = '\0';
    auStackY_4a8[0x1b] = '\0';
    auStackY_4a8[0x1c] = '\0';
    auStackY_4a8[0x1d] = '\0';
    auStackY_4a8[0x1e] = '\0';
    auStackY_4a8[0x1f] = '\0';
    auStackY_4a8[0] = '\0';
    auStackY_4a8[1] = '\0';
    auStackY_4a8[2] = '\0';
    auStackY_4a8[3] = '\0';
    auStackY_4a8[4] = '\0';
    auStackY_4a8[5] = '\0';
    auStackY_4a8[6] = '\0';
    auStackY_4a8[7] = '\0';
    auStackY_4a8[8] = '\0';
    auStackY_4a8[9] = '\0';
    auStackY_4a8[10] = '\0';
    auStackY_4a8[0xb] = '\0';
    auStackY_4a8[0xc] = '\0';
    auStackY_4a8[0xd] = '\0';
    auStackY_4a8[0xe] = '\0';
    auStackY_4a8[0xf] = '\0';
    auStackY_4b8[0] = '\0';
    auStackY_4b8[1] = '\0';
    auStackY_4b8[2] = '\0';
    auStackY_4b8[3] = '\0';
    auStackY_4b8[4] = '\0';
    auStackY_4b8[5] = '\0';
    auStackY_4b8[6] = '\0';
    auStackY_4b8[7] = '\0';
    psStackY_4b0 = (secp256k1_pubkey *)0x0;
    auStackY_408[0] = '\x01';
    auStackY_408[1] = '\0';
    auStackY_408[2] = 'C';
    auStackY_408[3] = 'M';
    auStackY_408[4] = '\0';
    auStackY_408[5] = '\0';
    auStackY_408[6] = '\0';
    auStackY_408[7] = '\0';
    auStackY_3f8[0] = '@';
    auStackY_3f8[1] = '\0';
    auStackY_3f8[2] = '\0';
    auStackY_3f8[3] = '\0';
    auStackY_3f8[4] = '\0';
    auStackY_3f8[5] = '\0';
    auStackY_3f8[6] = '\0';
    auStackY_3f8[7] = '\0';
    auStackY_3f8[8] = '\0';
    auStackY_3f8[9] = '\0';
    auStackY_3f8[10] = '\0';
    auStackY_3f8[0xb] = '\0';
    auStackY_3f8[0xc] = '\0';
    auStackY_3f8[0xd] = '\0';
    auStackY_3f8[0xe] = '\0';
    auStackY_3f8[0xf] = '\0';
    auStackY_3f8[0x10] = '\0';
    auStackY_3f8[0x11] = '\0';
    auStackY_3f8[0x12] = '\0';
    auStackY_3f8[0x13] = '\0';
    auStackY_3f8[0x14] = '\0';
    auStackY_3f8[0x15] = '\0';
    auStackY_3f8[0x16] = '\0';
    auStackY_3f8[0x17] = '\0';
    auStackY_3f8[0x18] = '\0';
    auStackY_3f8[0x19] = '\0';
    auStackY_3f8[0x1a] = '\0';
    auStackY_3f8[0x1b] = '\0';
    auStackY_3f8[0x1c] = '\0';
    auStackY_3f8[0x1d] = '\0';
    auStackY_3f8[0x1e] = '\0';
    auStackY_3f8[0x1f] = '\0';
    auStackY_368[0] = '\0';
    auStackY_368[1] = '\0';
    auStackY_368[2] = '\0';
    auStackY_368[3] = '\0';
    auStackY_368[4] = '\0';
    auStackY_368[5] = '\0';
    auStackY_368[6] = '\0';
    auStackY_368[7] = '\0';
    psStackY_400 = (secp256k1_pubkey *)auStackY_4b8;
    iVar3 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)auStackY_4b8,abStackY_468);
    if (iVar3 == 0) goto LAB_0013f705;
    auStackY_408[0] = '\x05';
    auStackY_408[1] = '\0';
    auStackY_408[2] = 'C';
    auStackY_408[3] = 'M';
    auStackY_408[4] = '\0';
    auStackY_408[5] = '\0';
    auStackY_408[6] = '\0';
    auStackY_408[7] = '\0';
    psStackY_400 = (secp256k1_pubkey *)auStackY_4b8;
    auStackY_3f8[0] = '@';
    auStackY_3f8[1] = '\0';
    auStackY_3f8[2] = '\0';
    auStackY_3f8[3] = '\0';
    auStackY_3f8[4] = '\0';
    auStackY_3f8[5] = '\0';
    auStackY_3f8[6] = '\0';
    auStackY_3f8[7] = '\0';
    lVar10 = 0;
    auStackY_3f8[8] = '\0';
    auStackY_3f8[9] = '\0';
    auStackY_3f8[10] = '\0';
    auStackY_3f8[0xb] = '\0';
    auStackY_3f8[0xc] = '\0';
    auStackY_3f8[0xd] = '\0';
    auStackY_3f8[0xe] = '\0';
    auStackY_3f8[0xf] = '\0';
    auStackY_3f8[0x10] = '\0';
    auStackY_3f8[0x11] = '\0';
    auStackY_3f8[0x12] = '\0';
    auStackY_3f8[0x13] = '\0';
    auStackY_3f8[0x14] = '\0';
    auStackY_3f8[0x15] = '\0';
    auStackY_3f8[0x16] = '\0';
    auStackY_3f8[0x17] = '\0';
    auStackY_3f8[0x18] = '\0';
    auStackY_3f8[0x19] = '\0';
    auStackY_3f8[0x1a] = '\0';
    auStackY_3f8[0x1b] = '\0';
    auStackY_3f8[0x1c] = '\0';
    auStackY_3f8[0x1d] = '\0';
    auStackY_3f8[0x1e] = '\0';
    auStackY_3f8[0x1f] = '\0';
    auStackY_368[0] = '\0';
    auStackY_368[1] = '\0';
    auStackY_368[2] = '\0';
    auStackY_368[3] = '\0';
    auStackY_368[4] = '\0';
    auStackY_368[5] = '\0';
    auStackY_368[6] = '\0';
    auStackY_368[7] = '\0';
    do {
      iVar3 = (uint)(byte)auStackY_4b8[lVar10] - (uint)(byte)auStackY_3c8[lVar10];
      if (auStackY_4b8[lVar10] != auStackY_3c8[lVar10]) goto LAB_0013e068;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x40);
    iVar3 = 0;
LAB_0013e068:
    if (iVar3 < 1) goto LAB_0013f70a;
    auStackY_338[0] = auStackY_4a8[0x20];
    auStackY_338[1] = auStackY_4a8[0x21];
    auStackY_338[2] = auStackY_4a8[0x22];
    auStackY_338[3] = auStackY_4a8[0x23];
    auStackY_338[4] = auStackY_4a8[0x24];
    auStackY_338[5] = auStackY_4a8[0x25];
    auStackY_338[6] = auStackY_4a8[0x26];
    auStackY_338[7] = auStackY_4a8[0x27];
    auStackY_330[0] = auStackY_4a8[0x28];
    auStackY_330[1] = auStackY_4a8[0x29];
    auStackY_330[2] = auStackY_4a8[0x2a];
    auStackY_330[3] = auStackY_4a8[0x2b];
    auStackY_330[4] = auStackY_4a8[0x2c];
    auStackY_330[5] = auStackY_4a8[0x2d];
    auStackY_330[6] = auStackY_4a8[0x2e];
    auStackY_330[7] = auStackY_4a8[0x2f];
    auStackY_348[0] = auStackY_4a8[0x10];
    auStackY_348[1] = auStackY_4a8[0x11];
    auStackY_348[2] = auStackY_4a8[0x12];
    auStackY_348[3] = auStackY_4a8[0x13];
    auStackY_348[4] = auStackY_4a8[0x14];
    auStackY_348[5] = auStackY_4a8[0x15];
    auStackY_348[6] = auStackY_4a8[0x16];
    auStackY_348[7] = auStackY_4a8[0x17];
    auStackY_340[0] = auStackY_4a8[0x18];
    auStackY_340[1] = auStackY_4a8[0x19];
    auStackY_340[2] = auStackY_4a8[0x1a];
    auStackY_340[3] = auStackY_4a8[0x1b];
    auStackY_340[4] = auStackY_4a8[0x1c];
    auStackY_340[5] = auStackY_4a8[0x1d];
    auStackY_340[6] = auStackY_4a8[0x1e];
    auStackY_340[7] = auStackY_4a8[0x1f];
    auStackY_358[0] = auStackY_4a8[0];
    auStackY_358[1] = auStackY_4a8[1];
    auStackY_358[2] = auStackY_4a8[2];
    auStackY_358[3] = auStackY_4a8[3];
    auStackY_358[4] = auStackY_4a8[4];
    auStackY_358[5] = auStackY_4a8[5];
    auStackY_358[6] = auStackY_4a8[6];
    auStackY_358[7] = auStackY_4a8[7];
    auStackY_350[0] = auStackY_4a8[8];
    auStackY_350[1] = auStackY_4a8[9];
    auStackY_350[2] = auStackY_4a8[10];
    auStackY_350[3] = auStackY_4a8[0xb];
    auStackY_350[4] = auStackY_4a8[0xc];
    auStackY_350[5] = auStackY_4a8[0xd];
    auStackY_350[6] = auStackY_4a8[0xe];
    auStackY_350[7] = auStackY_4a8[0xf];
    auStackY_368._0_8_ = auStackY_4b8;
    auStackY_368._8_8_ = psStackY_4b0;
    auStackY_460[8] = auStackY_380[8];
    auStackY_460[9] = auStackY_380[9];
    auStackY_460[10] = auStackY_380[10];
    auStackY_460[0xb] = auStackY_380[0xb];
    auStackY_460[0xc] = auStackY_380[0xc];
    auStackY_460[0xd] = auStackY_380[0xd];
    auStackY_460[0xe] = auStackY_380[0xe];
    auStackY_460[0xf] = auStackY_380[0xf];
    abStackY_468[0] = abStackY_388[0];
    abStackY_468[1] = abStackY_388[1];
    abStackY_468[2] = abStackY_388[2];
    abStackY_468[3] = abStackY_388[3];
    abStackY_468[4] = abStackY_388[4];
    abStackY_468[5] = abStackY_388[5];
    abStackY_468[6] = abStackY_388[6];
    abStackY_468[7] = abStackY_388[7];
    auStackY_460[0] = auStackY_380[0];
    auStackY_460[1] = auStackY_380[1];
    auStackY_460[2] = auStackY_380[2];
    auStackY_460[3] = auStackY_380[3];
    auStackY_460[4] = auStackY_380[4];
    auStackY_460[5] = auStackY_380[5];
    auStackY_460[6] = auStackY_380[6];
    auStackY_460[7] = auStackY_380[7];
    uStackY_450._0_7_ = (undefined7)auStackY_380._16_8_;
    uStackY_450._7_1_ = 'B';
    iVar3 = secp256k1_ec_seckey_verify(CTX,abStackY_468);
    if (iVar3 != 0) goto LAB_0013f70f;
    builtin_memcpy(auStackY_4a8 + 0x20,
                   "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
    builtin_memcpy(auStackY_4a8 + 0x10,
                   "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
    builtin_memcpy(auStackY_4a8,"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",
                   0x10);
    auStackY_4b8[0] = '\x01';
    auStackY_4b8[1] = '\x01';
    auStackY_4b8[2] = '\x01';
    auStackY_4b8[3] = '\x01';
    auStackY_4b8[4] = '\x01';
    auStackY_4b8[5] = '\x01';
    auStackY_4b8[6] = '\x01';
    auStackY_4b8[7] = '\x01';
    psStackY_4b0 = (secp256k1_pubkey *)0x101010101010101;
    auStackY_408[0] = '\x01';
    auStackY_408[1] = '\0';
    auStackY_408[2] = 'C';
    auStackY_408[3] = 'M';
    auStackY_408[4] = '\0';
    auStackY_408[5] = '\0';
    auStackY_408[6] = '\0';
    auStackY_408[7] = '\0';
    auStackY_3f8[0] = '@';
    auStackY_3f8[1] = '\0';
    auStackY_3f8[2] = '\0';
    auStackY_3f8[3] = '\0';
    auStackY_3f8[4] = '\0';
    auStackY_3f8[5] = '\0';
    auStackY_3f8[6] = '\0';
    auStackY_3f8[7] = '\0';
    auStackY_3f8[8] = '\0';
    auStackY_3f8[9] = '\0';
    auStackY_3f8[10] = '\0';
    auStackY_3f8[0xb] = '\0';
    auStackY_3f8[0xc] = '\0';
    auStackY_3f8[0xd] = '\0';
    auStackY_3f8[0xe] = '\0';
    auStackY_3f8[0xf] = '\0';
    auStackY_3f8[0x10] = '\0';
    auStackY_3f8[0x11] = '\0';
    auStackY_3f8[0x12] = '\0';
    auStackY_3f8[0x13] = '\0';
    auStackY_3f8[0x14] = '\0';
    auStackY_3f8[0x15] = '\0';
    auStackY_3f8[0x16] = '\0';
    auStackY_3f8[0x17] = '\0';
    auStackY_3f8[0x18] = '\0';
    auStackY_3f8[0x19] = '\0';
    auStackY_3f8[0x1a] = '\0';
    auStackY_3f8[0x1b] = '\0';
    auStackY_3f8[0x1c] = '\0';
    auStackY_3f8[0x1d] = '\0';
    auStackY_3f8[0x1e] = '\0';
    auStackY_3f8[0x1f] = '\0';
    auStackY_2d8[0] = '\0';
    auStackY_2d8[1] = '\0';
    auStackY_2d8[2] = '\0';
    auStackY_2d8[3] = '\0';
    auStackY_2d8[4] = '\0';
    auStackY_2d8[5] = '\0';
    auStackY_2d8[6] = '\0';
    auStackY_2d8[7] = '\0';
    psStackY_400 = (secp256k1_pubkey *)auStackY_4b8;
    iVar3 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)auStackY_4b8,abStackY_468);
    if (iVar3 != 0) goto LAB_0013f714;
    auStackY_408[0] = '\x05';
    auStackY_408[1] = '\0';
    auStackY_408[2] = 'C';
    auStackY_408[3] = 'M';
    auStackY_408[4] = '\0';
    auStackY_408[5] = '\0';
    auStackY_408[6] = '\0';
    auStackY_408[7] = '\0';
    psStackY_400 = (secp256k1_pubkey *)auStackY_4b8;
    auStackY_3f8[0] = '@';
    auStackY_3f8[1] = '\0';
    auStackY_3f8[2] = '\0';
    auStackY_3f8[3] = '\0';
    auStackY_3f8[4] = '\0';
    auStackY_3f8[5] = '\0';
    auStackY_3f8[6] = '\0';
    auStackY_3f8[7] = '\0';
    lVar10 = 0;
    auStackY_3f8[8] = '\0';
    auStackY_3f8[9] = '\0';
    auStackY_3f8[10] = '\0';
    auStackY_3f8[0xb] = '\0';
    auStackY_3f8[0xc] = '\0';
    auStackY_3f8[0xd] = '\0';
    auStackY_3f8[0xe] = '\0';
    auStackY_3f8[0xf] = '\0';
    auStackY_3f8[0x10] = '\0';
    auStackY_3f8[0x11] = '\0';
    auStackY_3f8[0x12] = '\0';
    auStackY_3f8[0x13] = '\0';
    auStackY_3f8[0x14] = '\0';
    auStackY_3f8[0x15] = '\0';
    auStackY_3f8[0x16] = '\0';
    auStackY_3f8[0x17] = '\0';
    auStackY_3f8[0x18] = '\0';
    auStackY_3f8[0x19] = '\0';
    auStackY_3f8[0x1a] = '\0';
    auStackY_3f8[0x1b] = '\0';
    auStackY_3f8[0x1c] = '\0';
    auStackY_3f8[0x1d] = '\0';
    auStackY_3f8[0x1e] = '\0';
    auStackY_3f8[0x1f] = '\0';
    auStackY_2d8[0] = '\0';
    auStackY_2d8[1] = '\0';
    auStackY_2d8[2] = '\0';
    auStackY_2d8[3] = '\0';
    auStackY_2d8[4] = '\0';
    auStackY_2d8[5] = '\0';
    auStackY_2d8[6] = '\0';
    auStackY_2d8[7] = '\0';
    do {
      iVar3 = (uint)(byte)auStackY_4b8[lVar10] - (uint)(byte)auStackY_3c8[lVar10];
      if (auStackY_4b8[lVar10] != auStackY_3c8[lVar10]) goto LAB_0013e1d1;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x40);
    iVar3 = 0;
LAB_0013e1d1:
    if (iVar3 != 0) goto LAB_0013f719;
    uStackY_450._7_1_ = '@';
    iVar3 = secp256k1_ec_seckey_verify(CTX,abStackY_468);
    if (iVar3 == 0) goto LAB_0013f71e;
    auStackY_4a8[0x20] = '\0';
    auStackY_4a8[0x21] = '\0';
    auStackY_4a8[0x22] = '\0';
    auStackY_4a8[0x23] = '\0';
    auStackY_4a8[0x24] = '\0';
    auStackY_4a8[0x25] = '\0';
    auStackY_4a8[0x26] = '\0';
    auStackY_4a8[0x27] = '\0';
    auStackY_4a8[0x28] = '\0';
    auStackY_4a8[0x29] = '\0';
    auStackY_4a8[0x2a] = '\0';
    auStackY_4a8[0x2b] = '\0';
    auStackY_4a8[0x2c] = '\0';
    auStackY_4a8[0x2d] = '\0';
    auStackY_4a8[0x2e] = '\0';
    auStackY_4a8[0x2f] = '\0';
    auStackY_4a8[0x10] = '\0';
    auStackY_4a8[0x11] = '\0';
    auStackY_4a8[0x12] = '\0';
    auStackY_4a8[0x13] = '\0';
    auStackY_4a8[0x14] = '\0';
    auStackY_4a8[0x15] = '\0';
    auStackY_4a8[0x16] = '\0';
    auStackY_4a8[0x17] = '\0';
    auStackY_4a8[0x18] = '\0';
    auStackY_4a8[0x19] = '\0';
    auStackY_4a8[0x1a] = '\0';
    auStackY_4a8[0x1b] = '\0';
    auStackY_4a8[0x1c] = '\0';
    auStackY_4a8[0x1d] = '\0';
    auStackY_4a8[0x1e] = '\0';
    auStackY_4a8[0x1f] = '\0';
    auStackY_4a8[0] = '\0';
    auStackY_4a8[1] = '\0';
    auStackY_4a8[2] = '\0';
    auStackY_4a8[3] = '\0';
    auStackY_4a8[4] = '\0';
    auStackY_4a8[5] = '\0';
    auStackY_4a8[6] = '\0';
    auStackY_4a8[7] = '\0';
    auStackY_4a8[8] = '\0';
    auStackY_4a8[9] = '\0';
    auStackY_4a8[10] = '\0';
    auStackY_4a8[0xb] = '\0';
    auStackY_4a8[0xc] = '\0';
    auStackY_4a8[0xd] = '\0';
    auStackY_4a8[0xe] = '\0';
    auStackY_4a8[0xf] = '\0';
    auStackY_4b8[0] = '\0';
    auStackY_4b8[1] = '\0';
    auStackY_4b8[2] = '\0';
    auStackY_4b8[3] = '\0';
    auStackY_4b8[4] = '\0';
    auStackY_4b8[5] = '\0';
    auStackY_4b8[6] = '\0';
    auStackY_4b8[7] = '\0';
    psStackY_4b0 = (secp256k1_pubkey *)0x0;
    auStackY_408[0] = '\x01';
    auStackY_408[1] = '\0';
    auStackY_408[2] = 'C';
    auStackY_408[3] = 'M';
    auStackY_408[4] = '\0';
    auStackY_408[5] = '\0';
    auStackY_408[6] = '\0';
    auStackY_408[7] = '\0';
    auStackY_3f8[0] = '@';
    auStackY_3f8[1] = '\0';
    auStackY_3f8[2] = '\0';
    auStackY_3f8[3] = '\0';
    auStackY_3f8[4] = '\0';
    auStackY_3f8[5] = '\0';
    auStackY_3f8[6] = '\0';
    auStackY_3f8[7] = '\0';
    auStackY_3f8[8] = '\0';
    auStackY_3f8[9] = '\0';
    auStackY_3f8[10] = '\0';
    auStackY_3f8[0xb] = '\0';
    auStackY_3f8[0xc] = '\0';
    auStackY_3f8[0xd] = '\0';
    auStackY_3f8[0xe] = '\0';
    auStackY_3f8[0xf] = '\0';
    auStackY_3f8[0x10] = '\0';
    auStackY_3f8[0x11] = '\0';
    auStackY_3f8[0x12] = '\0';
    auStackY_3f8[0x13] = '\0';
    auStackY_3f8[0x14] = '\0';
    auStackY_3f8[0x15] = '\0';
    auStackY_3f8[0x16] = '\0';
    auStackY_3f8[0x17] = '\0';
    auStackY_3f8[0x18] = '\0';
    auStackY_3f8[0x19] = '\0';
    auStackY_3f8[0x1a] = '\0';
    auStackY_3f8[0x1b] = '\0';
    auStackY_3f8[0x1c] = '\0';
    auStackY_3f8[0x1d] = '\0';
    auStackY_3f8[0x1e] = '\0';
    auStackY_3f8[0x1f] = '\0';
    auStackY_2d8[0] = '\0';
    auStackY_2d8[1] = '\0';
    auStackY_2d8[2] = '\0';
    auStackY_2d8[3] = '\0';
    auStackY_2d8[4] = '\0';
    auStackY_2d8[5] = '\0';
    auStackY_2d8[6] = '\0';
    auStackY_2d8[7] = '\0';
    psStackY_400 = (secp256k1_pubkey *)auStackY_4b8;
    iVar3 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)auStackY_4b8,abStackY_468);
    if (iVar3 == 0) goto LAB_0013f723;
    auStackY_408[0] = '\x05';
    auStackY_408[1] = '\0';
    auStackY_408[2] = 'C';
    auStackY_408[3] = 'M';
    auStackY_408[4] = '\0';
    auStackY_408[5] = '\0';
    auStackY_408[6] = '\0';
    auStackY_408[7] = '\0';
    psStackY_400 = (secp256k1_pubkey *)auStackY_4b8;
    auStackY_3f8[0] = '@';
    auStackY_3f8[1] = '\0';
    auStackY_3f8[2] = '\0';
    auStackY_3f8[3] = '\0';
    auStackY_3f8[4] = '\0';
    auStackY_3f8[5] = '\0';
    auStackY_3f8[6] = '\0';
    auStackY_3f8[7] = '\0';
    lVar10 = 0;
    auStackY_3f8[8] = '\0';
    auStackY_3f8[9] = '\0';
    auStackY_3f8[10] = '\0';
    auStackY_3f8[0xb] = '\0';
    auStackY_3f8[0xc] = '\0';
    auStackY_3f8[0xd] = '\0';
    auStackY_3f8[0xe] = '\0';
    auStackY_3f8[0xf] = '\0';
    auStackY_3f8[0x10] = '\0';
    auStackY_3f8[0x11] = '\0';
    auStackY_3f8[0x12] = '\0';
    auStackY_3f8[0x13] = '\0';
    auStackY_3f8[0x14] = '\0';
    auStackY_3f8[0x15] = '\0';
    auStackY_3f8[0x16] = '\0';
    auStackY_3f8[0x17] = '\0';
    auStackY_3f8[0x18] = '\0';
    auStackY_3f8[0x19] = '\0';
    auStackY_3f8[0x1a] = '\0';
    auStackY_3f8[0x1b] = '\0';
    auStackY_3f8[0x1c] = '\0';
    auStackY_3f8[0x1d] = '\0';
    auStackY_3f8[0x1e] = '\0';
    auStackY_3f8[0x1f] = '\0';
    auStackY_2d8[0] = '\0';
    auStackY_2d8[1] = '\0';
    auStackY_2d8[2] = '\0';
    auStackY_2d8[3] = '\0';
    auStackY_2d8[4] = '\0';
    auStackY_2d8[5] = '\0';
    auStackY_2d8[6] = '\0';
    auStackY_2d8[7] = '\0';
    do {
      iVar3 = (uint)(byte)auStackY_4b8[lVar10] - (uint)(byte)auStackY_3c8[lVar10];
      if (auStackY_4b8[lVar10] != auStackY_3c8[lVar10]) goto LAB_0013e2eb;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x40);
    iVar3 = 0;
LAB_0013e2eb:
    if (iVar3 < 1) goto LAB_0013f728;
    auStackY_2a8[0] = auStackY_4a8[0x20];
    auStackY_2a8[1] = auStackY_4a8[0x21];
    auStackY_2a8[2] = auStackY_4a8[0x22];
    auStackY_2a8[3] = auStackY_4a8[0x23];
    auStackY_2a8[4] = auStackY_4a8[0x24];
    auStackY_2a8[5] = auStackY_4a8[0x25];
    auStackY_2a8[6] = auStackY_4a8[0x26];
    auStackY_2a8[7] = auStackY_4a8[0x27];
    auStackY_2a0[0] = auStackY_4a8[0x28];
    auStackY_2a0[1] = auStackY_4a8[0x29];
    auStackY_2a0[2] = auStackY_4a8[0x2a];
    auStackY_2a0[3] = auStackY_4a8[0x2b];
    auStackY_2a0[4] = auStackY_4a8[0x2c];
    auStackY_2a0[5] = auStackY_4a8[0x2d];
    auStackY_2a0[6] = auStackY_4a8[0x2e];
    auStackY_2a0[7] = auStackY_4a8[0x2f];
    auStackY_2b8[0] = auStackY_4a8[0x10];
    auStackY_2b8[1] = auStackY_4a8[0x11];
    auStackY_2b8[2] = auStackY_4a8[0x12];
    auStackY_2b8[3] = auStackY_4a8[0x13];
    auStackY_2b8[4] = auStackY_4a8[0x14];
    auStackY_2b8[5] = auStackY_4a8[0x15];
    auStackY_2b8[6] = auStackY_4a8[0x16];
    auStackY_2b8[7] = auStackY_4a8[0x17];
    auStackY_2b0[0] = auStackY_4a8[0x18];
    auStackY_2b0[1] = auStackY_4a8[0x19];
    auStackY_2b0[2] = auStackY_4a8[0x1a];
    auStackY_2b0[3] = auStackY_4a8[0x1b];
    auStackY_2b0[4] = auStackY_4a8[0x1c];
    auStackY_2b0[5] = auStackY_4a8[0x1d];
    auStackY_2b0[6] = auStackY_4a8[0x1e];
    auStackY_2b0[7] = auStackY_4a8[0x1f];
    auStackY_2c8[0] = auStackY_4a8[0];
    auStackY_2c8[1] = auStackY_4a8[1];
    auStackY_2c8[2] = auStackY_4a8[2];
    auStackY_2c8[3] = auStackY_4a8[3];
    auStackY_2c8[4] = auStackY_4a8[4];
    auStackY_2c8[5] = auStackY_4a8[5];
    auStackY_2c8[6] = auStackY_4a8[6];
    auStackY_2c8[7] = auStackY_4a8[7];
    auStackY_2c0[0] = auStackY_4a8[8];
    auStackY_2c0[1] = auStackY_4a8[9];
    auStackY_2c0[2] = auStackY_4a8[10];
    auStackY_2c0[3] = auStackY_4a8[0xb];
    auStackY_2c0[4] = auStackY_4a8[0xc];
    auStackY_2c0[5] = auStackY_4a8[0xd];
    auStackY_2c0[6] = auStackY_4a8[0xe];
    auStackY_2c0[7] = auStackY_4a8[0xf];
    auStackY_2d8._0_8_ = auStackY_4b8;
    auStackY_2d8._8_8_ = psStackY_4b0;
    abStackY_438[0] = 0;
    abStackY_438[1] = 0;
    abStackY_438[2] = 0;
    abStackY_438[3] = 0;
    abStackY_438[4] = 0;
    abStackY_438[5] = 0;
    abStackY_438[6] = 0;
    abStackY_438[7] = 0;
    abStackY_438[8] = 0;
    abStackY_438[9] = 0;
    abStackY_438[10] = 0;
    abStackY_438[0xb] = 0;
    abStackY_438[0xc] = 0;
    abStackY_438[0xd] = 0;
    abStackY_438[0xe] = 0;
    abStackY_438[0xf] = 0;
    abStackY_438[0x10] = 0;
    abStackY_438[0x11] = 0;
    abStackY_438[0x12] = 0;
    abStackY_438[0x13] = 0;
    abStackY_438[0x14] = 0;
    abStackY_438[0x15] = 0;
    abStackY_438[0x16] = 0;
    abStackY_438[0x17] = 0;
    abStackY_438[0x18] = 0;
    abStackY_438[0x19] = 0;
    abStackY_438[0x1a] = 0;
    abStackY_438[0x1b] = 0;
    abStackY_438[0x1c] = 0;
    abStackY_438[0x1d] = 0;
    abStackY_438[0x1e] = 0;
    abStackY_438[0x1f] = 0;
    iVar3 = secp256k1_ec_seckey_tweak_add(CTX,abStackY_468,abStackY_438);
    if (iVar3 == 0) goto LAB_0013f72d;
    lVar10 = 0;
    do {
      iVar3 = (uint)abStackY_388[lVar10] - (uint)abStackY_468[lVar10];
      if (abStackY_388[lVar10] != abStackY_468[lVar10]) goto LAB_0013e37a;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x1f);
    iVar3 = 0;
LAB_0013e37a:
    if ((iVar3 != 0) || (uStackY_450._7_1_ != '@')) goto LAB_0013f732;
    auStackY_3f8[0x20] = auStackY_4a8[0x20];
    auStackY_3f8[0x21] = auStackY_4a8[0x21];
    auStackY_3f8[0x22] = auStackY_4a8[0x22];
    auStackY_3f8[0x23] = auStackY_4a8[0x23];
    auStackY_3f8[0x24] = auStackY_4a8[0x24];
    auStackY_3f8[0x25] = auStackY_4a8[0x25];
    auStackY_3f8[0x26] = auStackY_4a8[0x26];
    auStackY_3f8[0x27] = auStackY_4a8[0x27];
    auStackY_3d0[0] = auStackY_4a8[0x28];
    auStackY_3d0[1] = auStackY_4a8[0x29];
    auStackY_3d0[2] = auStackY_4a8[0x2a];
    auStackY_3d0[3] = auStackY_4a8[0x2b];
    auStackY_3d0[4] = auStackY_4a8[0x2c];
    auStackY_3d0[5] = auStackY_4a8[0x2d];
    auStackY_3d0[6] = auStackY_4a8[0x2e];
    auStackY_3d0[7] = auStackY_4a8[0x2f];
    auStackY_3f8[0x10] = auStackY_4a8[0x10];
    auStackY_3f8[0x11] = auStackY_4a8[0x11];
    auStackY_3f8[0x12] = auStackY_4a8[0x12];
    auStackY_3f8[0x13] = auStackY_4a8[0x13];
    auStackY_3f8[0x14] = auStackY_4a8[0x14];
    auStackY_3f8[0x15] = auStackY_4a8[0x15];
    auStackY_3f8[0x16] = auStackY_4a8[0x16];
    auStackY_3f8[0x17] = auStackY_4a8[0x17];
    auStackY_3f8[0x18] = auStackY_4a8[0x18];
    auStackY_3f8[0x19] = auStackY_4a8[0x19];
    auStackY_3f8[0x1a] = auStackY_4a8[0x1a];
    auStackY_3f8[0x1b] = auStackY_4a8[0x1b];
    auStackY_3f8[0x1c] = auStackY_4a8[0x1c];
    auStackY_3f8[0x1d] = auStackY_4a8[0x1d];
    auStackY_3f8[0x1e] = auStackY_4a8[0x1e];
    auStackY_3f8[0x1f] = auStackY_4a8[0x1f];
    auStackY_3f8[0] = auStackY_4a8[0];
    auStackY_3f8[1] = auStackY_4a8[1];
    auStackY_3f8[2] = auStackY_4a8[2];
    auStackY_3f8[3] = auStackY_4a8[3];
    auStackY_3f8[4] = auStackY_4a8[4];
    auStackY_3f8[5] = auStackY_4a8[5];
    auStackY_3f8[6] = auStackY_4a8[6];
    auStackY_3f8[7] = auStackY_4a8[7];
    auStackY_3f8[8] = auStackY_4a8[8];
    auStackY_3f8[9] = auStackY_4a8[9];
    auStackY_3f8[10] = auStackY_4a8[10];
    auStackY_3f8[0xb] = auStackY_4a8[0xb];
    auStackY_3f8[0xc] = auStackY_4a8[0xc];
    auStackY_3f8[0xd] = auStackY_4a8[0xd];
    auStackY_3f8[0xe] = auStackY_4a8[0xe];
    auStackY_3f8[0xf] = auStackY_4a8[0xf];
    auStackY_408 = auStackY_4b8;
    psStackY_400 = psStackY_4b0;
    iVar3 = secp256k1_ec_pubkey_tweak_add(CTX,(secp256k1_pubkey *)auStackY_4b8,abStackY_438);
    if (iVar3 == 0) goto LAB_0013f737;
    lVar10 = 0;
    do {
      iVar3 = (uint)(byte)auStackY_4b8[lVar10] - (uint)(byte)auStackY_408[lVar10];
      if (auStackY_4b8[lVar10] != auStackY_408[lVar10]) goto LAB_0013e405;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x40);
    iVar3 = 0;
LAB_0013e405:
    if (iVar3 != 0) goto LAB_0013f73c;
    iVar3 = secp256k1_ec_seckey_tweak_mul(CTX,abStackY_468,abStackY_438);
    if (iVar3 != 0) goto LAB_0013f741;
    lVar10 = 0;
    do {
      iVar3 = (uint)(byte)auStackY_3c8[lVar10] - (uint)abStackY_468[lVar10];
      if (auStackY_3c8[lVar10] != abStackY_468[lVar10]) goto LAB_0013e456;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x20);
    iVar3 = 0;
LAB_0013e456:
    if (iVar3 != 0) goto LAB_0013f746;
    iVar3 = secp256k1_ec_pubkey_tweak_mul(CTX,(secp256k1_pubkey *)auStackY_4b8,abStackY_438);
    if (iVar3 != 0) goto LAB_0013f74b;
    lVar10 = 0;
    do {
      iVar3 = (uint)(byte)auStackY_4b8[lVar10] - (uint)(byte)auStackY_3c8[lVar10];
      if (auStackY_4b8[lVar10] != auStackY_3c8[lVar10]) goto LAB_0013e4a7;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x40);
    iVar3 = 0;
LAB_0013e4a7:
    if (iVar3 != 0) goto LAB_0013f750;
    auStackY_4a8[0x20] = auStackY_3f8[0x20];
    auStackY_4a8[0x21] = auStackY_3f8[0x21];
    auStackY_4a8[0x22] = auStackY_3f8[0x22];
    auStackY_4a8[0x23] = auStackY_3f8[0x23];
    auStackY_4a8[0x24] = auStackY_3f8[0x24];
    auStackY_4a8[0x25] = auStackY_3f8[0x25];
    auStackY_4a8[0x26] = auStackY_3f8[0x26];
    auStackY_4a8[0x27] = auStackY_3f8[0x27];
    auStackY_4a8[0x28] = auStackY_3d0[0];
    auStackY_4a8[0x29] = auStackY_3d0[1];
    auStackY_4a8[0x2a] = auStackY_3d0[2];
    auStackY_4a8[0x2b] = auStackY_3d0[3];
    auStackY_4a8[0x2c] = auStackY_3d0[4];
    auStackY_4a8[0x2d] = auStackY_3d0[5];
    auStackY_4a8[0x2e] = auStackY_3d0[6];
    auStackY_4a8[0x2f] = auStackY_3d0[7];
    auStackY_4a8[0x10] = auStackY_3f8[0x10];
    auStackY_4a8[0x11] = auStackY_3f8[0x11];
    auStackY_4a8[0x12] = auStackY_3f8[0x12];
    auStackY_4a8[0x13] = auStackY_3f8[0x13];
    auStackY_4a8[0x14] = auStackY_3f8[0x14];
    auStackY_4a8[0x15] = auStackY_3f8[0x15];
    auStackY_4a8[0x16] = auStackY_3f8[0x16];
    auStackY_4a8[0x17] = auStackY_3f8[0x17];
    auStackY_4a8[0x18] = auStackY_3f8[0x18];
    auStackY_4a8[0x19] = auStackY_3f8[0x19];
    auStackY_4a8[0x1a] = auStackY_3f8[0x1a];
    auStackY_4a8[0x1b] = auStackY_3f8[0x1b];
    auStackY_4a8[0x1c] = auStackY_3f8[0x1c];
    auStackY_4a8[0x1d] = auStackY_3f8[0x1d];
    auStackY_4a8[0x1e] = auStackY_3f8[0x1e];
    auStackY_4a8[0x1f] = auStackY_3f8[0x1f];
    auStackY_4a8[0] = auStackY_3f8[0];
    auStackY_4a8[1] = auStackY_3f8[1];
    auStackY_4a8[2] = auStackY_3f8[2];
    auStackY_4a8[3] = auStackY_3f8[3];
    auStackY_4a8[4] = auStackY_3f8[4];
    auStackY_4a8[5] = auStackY_3f8[5];
    auStackY_4a8[6] = auStackY_3f8[6];
    auStackY_4a8[7] = auStackY_3f8[7];
    auStackY_4a8[8] = auStackY_3f8[8];
    auStackY_4a8[9] = auStackY_3f8[9];
    auStackY_4a8[10] = auStackY_3f8[10];
    auStackY_4a8[0xb] = auStackY_3f8[0xb];
    auStackY_4a8[0xc] = auStackY_3f8[0xc];
    auStackY_4a8[0xd] = auStackY_3f8[0xd];
    auStackY_4a8[0xe] = auStackY_3f8[0xe];
    auStackY_4a8[0xf] = auStackY_3f8[0xf];
    auStackY_4b8 = auStackY_408;
    psStackY_4b0 = psStackY_400;
    abStackY_468[0] = abStackY_388[0];
    abStackY_468[1] = abStackY_388[1];
    abStackY_468[2] = abStackY_388[2];
    abStackY_468[3] = abStackY_388[3];
    abStackY_468[4] = abStackY_388[4];
    abStackY_468[5] = abStackY_388[5];
    abStackY_468[6] = abStackY_388[6];
    abStackY_468[7] = abStackY_388[7];
    auStackY_460[0] = auStackY_380[0];
    auStackY_460[1] = auStackY_380[1];
    auStackY_460[2] = auStackY_380[2];
    auStackY_460[3] = auStackY_380[3];
    auStackY_460[4] = auStackY_380[4];
    auStackY_460[5] = auStackY_380[5];
    auStackY_460[6] = auStackY_380[6];
    auStackY_460[7] = auStackY_380[7];
    auStackY_460[8] = auStackY_380[8];
    auStackY_460[9] = auStackY_380[9];
    auStackY_460[10] = auStackY_380[10];
    auStackY_460[0xb] = auStackY_380[0xb];
    auStackY_460[0xc] = auStackY_380[0xc];
    auStackY_460[0xd] = auStackY_380[0xd];
    auStackY_460[0xe] = auStackY_380[0xe];
    auStackY_460[0xf] = auStackY_380[0xf];
    uStackY_450._0_1_ = auStackY_380[0x10];
    uStackY_450._1_1_ = auStackY_380[0x11];
    uStackY_450._2_1_ = auStackY_380[0x12];
    uStackY_450._3_1_ = auStackY_380[0x13];
    uStackY_450._4_1_ = auStackY_380[0x14];
    uStackY_450._5_1_ = auStackY_380[0x15];
    uStackY_450._6_1_ = auStackY_380[0x16];
    uStackY_450._7_1_ = auStackY_380[0x17];
    abStackY_438[0x10] = 0;
    abStackY_438[0x11] = 0;
    abStackY_438[0x12] = 0;
    abStackY_438[0x13] = 0;
    abStackY_438[0x14] = 0;
    abStackY_438[0x15] = 0;
    abStackY_438[0x16] = 0;
    abStackY_438[0x17] = 0;
    abStackY_438[0] = 0;
    abStackY_438[1] = 0;
    abStackY_438[2] = 0;
    abStackY_438[3] = 0;
    abStackY_438[4] = 0;
    abStackY_438[5] = 0;
    abStackY_438[6] = 0;
    abStackY_438[7] = 0;
    abStackY_438[8] = 0;
    abStackY_438[9] = 0;
    abStackY_438[10] = 0;
    abStackY_438[0xb] = 0;
    abStackY_438[0xc] = 0;
    abStackY_438[0xd] = 0;
    abStackY_438[0xe] = 0;
    abStackY_438[0xf] = 0;
    abStackY_438[0x18] = 0;
    abStackY_438[0x19] = 0;
    abStackY_438[0x1a] = 0;
    abStackY_438[0x1b] = 0;
    abStackY_438[0x1c] = 0;
    abStackY_438[0x1d] = 0;
    abStackY_438[0x1e] = 0;
    abStackY_438[0x1f] = 1;
    iVar3 = secp256k1_ec_seckey_verify(CTX,abStackY_438);
    if (iVar3 == 0) goto LAB_0013f755;
    iVar3 = secp256k1_ec_seckey_verify(CTX,abStackY_468);
    if (iVar3 != 0) goto LAB_0013f75a;
    iVar3 = secp256k1_ec_seckey_tweak_add(CTX,abStackY_468,abStackY_438);
    if (iVar3 != 0) goto LAB_0013f75f;
    lVar10 = 0;
    do {
      iVar3 = (uint)(byte)auStackY_3c8[lVar10] - (uint)abStackY_468[lVar10];
      if (auStackY_3c8[lVar10] != abStackY_468[lVar10]) goto LAB_0013e589;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x20);
    iVar3 = 0;
LAB_0013e589:
    if (iVar3 != 0) goto LAB_0013f764;
    auStackY_460[8] = auStackY_380[8];
    auStackY_460[9] = auStackY_380[9];
    auStackY_460[10] = auStackY_380[10];
    auStackY_460[0xb] = auStackY_380[0xb];
    auStackY_460[0xc] = auStackY_380[0xc];
    auStackY_460[0xd] = auStackY_380[0xd];
    auStackY_460[0xe] = auStackY_380[0xe];
    auStackY_460[0xf] = auStackY_380[0xf];
    uStackY_450._0_1_ = auStackY_380[0x10];
    uStackY_450._1_1_ = auStackY_380[0x11];
    uStackY_450._2_1_ = auStackY_380[0x12];
    uStackY_450._3_1_ = auStackY_380[0x13];
    uStackY_450._4_1_ = auStackY_380[0x14];
    uStackY_450._5_1_ = auStackY_380[0x15];
    uStackY_450._6_1_ = auStackY_380[0x16];
    uStackY_450._7_1_ = auStackY_380[0x17];
    abStackY_468[0] = abStackY_388[0];
    abStackY_468[1] = abStackY_388[1];
    abStackY_468[2] = abStackY_388[2];
    abStackY_468[3] = abStackY_388[3];
    abStackY_468[4] = abStackY_388[4];
    abStackY_468[5] = abStackY_388[5];
    abStackY_468[6] = abStackY_388[6];
    abStackY_468[7] = abStackY_388[7];
    auStackY_460[0] = auStackY_380[0];
    auStackY_460[1] = auStackY_380[1];
    auStackY_460[2] = auStackY_380[2];
    auStackY_460[3] = auStackY_380[3];
    auStackY_460[4] = auStackY_380[4];
    auStackY_460[5] = auStackY_380[5];
    auStackY_460[6] = auStackY_380[6];
    auStackY_460[7] = auStackY_380[7];
    iVar3 = secp256k1_ec_seckey_tweak_mul(CTX,abStackY_468,abStackY_438);
    if (iVar3 != 0) goto LAB_0013f769;
    lVar10 = 0;
    do {
      iVar3 = (uint)(byte)auStackY_3c8[lVar10] - (uint)abStackY_468[lVar10];
      if (auStackY_3c8[lVar10] != abStackY_468[lVar10]) goto LAB_0013e5f1;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x20);
    iVar3 = 0;
LAB_0013e5f1:
    if (iVar3 != 0) goto LAB_0013f76e;
    auStackY_460[8] = auStackY_380[8];
    auStackY_460[9] = auStackY_380[9];
    auStackY_460[10] = auStackY_380[10];
    auStackY_460[0xb] = auStackY_380[0xb];
    auStackY_460[0xc] = auStackY_380[0xc];
    auStackY_460[0xd] = auStackY_380[0xd];
    auStackY_460[0xe] = auStackY_380[0xe];
    auStackY_460[0xf] = auStackY_380[0xf];
    abStackY_468[0] = abStackY_388[0];
    abStackY_468[1] = abStackY_388[1];
    abStackY_468[2] = abStackY_388[2];
    abStackY_468[3] = abStackY_388[3];
    abStackY_468[4] = abStackY_388[4];
    abStackY_468[5] = abStackY_388[5];
    abStackY_468[6] = abStackY_388[6];
    abStackY_468[7] = abStackY_388[7];
    auStackY_460[0] = auStackY_380[0];
    auStackY_460[1] = auStackY_380[1];
    auStackY_460[2] = auStackY_380[2];
    auStackY_460[3] = auStackY_380[3];
    auStackY_460[4] = auStackY_380[4];
    auStackY_460[5] = auStackY_380[5];
    auStackY_460[6] = auStackY_380[6];
    auStackY_460[7] = auStackY_380[7];
    uStackY_450._0_7_ = (undefined7)auStackY_380._16_8_;
    uStackY_450._7_1_ = '@';
    iVar3 = secp256k1_ec_seckey_tweak_add(CTX,abStackY_468,abStackY_388);
    if (iVar3 != 0) goto LAB_0013f773;
    lVar10 = 0;
    do {
      iVar3 = (uint)(byte)auStackY_3c8[lVar10] - (uint)abStackY_468[lVar10];
      if (auStackY_3c8[lVar10] != abStackY_468[lVar10]) goto LAB_0013e654;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x20);
    iVar3 = 0;
LAB_0013e654:
    if (iVar3 != 0) goto LAB_0013f778;
    auStackY_460[8] = auStackY_380[8];
    auStackY_460[9] = auStackY_380[9];
    auStackY_460[10] = auStackY_380[10];
    auStackY_460[0xb] = auStackY_380[0xb];
    auStackY_460[0xc] = auStackY_380[0xc];
    auStackY_460[0xd] = auStackY_380[0xd];
    auStackY_460[0xe] = auStackY_380[0xe];
    auStackY_460[0xf] = auStackY_380[0xf];
    abStackY_468[0] = abStackY_388[0];
    abStackY_468[1] = abStackY_388[1];
    abStackY_468[2] = abStackY_388[2];
    abStackY_468[3] = abStackY_388[3];
    abStackY_468[4] = abStackY_388[4];
    abStackY_468[5] = abStackY_388[5];
    abStackY_468[6] = abStackY_388[6];
    abStackY_468[7] = abStackY_388[7];
    auStackY_460[0] = auStackY_380[0];
    auStackY_460[1] = auStackY_380[1];
    auStackY_460[2] = auStackY_380[2];
    auStackY_460[3] = auStackY_380[3];
    auStackY_460[4] = auStackY_380[4];
    auStackY_460[5] = auStackY_380[5];
    auStackY_460[6] = auStackY_380[6];
    auStackY_460[7] = auStackY_380[7];
    uStackY_450._0_7_ = (undefined7)auStackY_380._16_8_;
    uStackY_450._7_1_ = '@';
    iVar3 = secp256k1_ec_seckey_tweak_mul(CTX,abStackY_468,abStackY_388);
    if (iVar3 != 0) goto LAB_0013f77d;
    lVar10 = 0;
    do {
      iVar3 = (uint)(byte)auStackY_3c8[lVar10] - (uint)abStackY_468[lVar10];
      if (auStackY_3c8[lVar10] != abStackY_468[lVar10]) goto LAB_0013e6b7;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x20);
    iVar3 = 0;
LAB_0013e6b7:
    if (iVar3 != 0) goto LAB_0013f782;
    auStackY_460[8] = auStackY_380[8];
    auStackY_460[9] = auStackY_380[9];
    auStackY_460[10] = auStackY_380[10];
    auStackY_460[0xb] = auStackY_380[0xb];
    auStackY_460[0xc] = auStackY_380[0xc];
    auStackY_460[0xd] = auStackY_380[0xd];
    auStackY_460[0xe] = auStackY_380[0xe];
    auStackY_460[0xf] = auStackY_380[0xf];
    abStackY_468[0] = abStackY_388[0];
    abStackY_468[1] = abStackY_388[1];
    abStackY_468[2] = abStackY_388[2];
    abStackY_468[3] = abStackY_388[3];
    abStackY_468[4] = abStackY_388[4];
    abStackY_468[5] = abStackY_388[5];
    abStackY_468[6] = abStackY_388[6];
    abStackY_468[7] = abStackY_388[7];
    auStackY_460[0] = auStackY_380[0];
    auStackY_460[1] = auStackY_380[1];
    auStackY_460[2] = auStackY_380[2];
    auStackY_460[3] = auStackY_380[3];
    auStackY_460[4] = auStackY_380[4];
    auStackY_460[5] = auStackY_380[5];
    auStackY_460[6] = auStackY_380[6];
    auStackY_460[7] = auStackY_380[7];
    uStackY_450._0_7_ = (undefined7)auStackY_380._16_8_;
    uStackY_450._7_1_ = '@';
    iVar3 = secp256k1_ec_pubkey_tweak_add(CTX,(secp256k1_pubkey *)auStackY_4b8,abStackY_388);
    if (iVar3 != 0) goto LAB_0013f787;
    lVar10 = 0;
    do {
      iVar3 = (uint)(byte)auStackY_4b8[lVar10] - (uint)(byte)auStackY_3c8[lVar10];
      if (auStackY_4b8[lVar10] != auStackY_3c8[lVar10]) goto LAB_0013e71e;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x40);
    iVar3 = 0;
LAB_0013e71e:
    if (iVar3 != 0) goto LAB_0013f78c;
    auStackY_4a8[0x20] = auStackY_3f8[0x20];
    auStackY_4a8[0x21] = auStackY_3f8[0x21];
    auStackY_4a8[0x22] = auStackY_3f8[0x22];
    auStackY_4a8[0x23] = auStackY_3f8[0x23];
    auStackY_4a8[0x24] = auStackY_3f8[0x24];
    auStackY_4a8[0x25] = auStackY_3f8[0x25];
    auStackY_4a8[0x26] = auStackY_3f8[0x26];
    auStackY_4a8[0x27] = auStackY_3f8[0x27];
    auStackY_4a8[0x28] = auStackY_3d0[0];
    auStackY_4a8[0x29] = auStackY_3d0[1];
    auStackY_4a8[0x2a] = auStackY_3d0[2];
    auStackY_4a8[0x2b] = auStackY_3d0[3];
    auStackY_4a8[0x2c] = auStackY_3d0[4];
    auStackY_4a8[0x2d] = auStackY_3d0[5];
    auStackY_4a8[0x2e] = auStackY_3d0[6];
    auStackY_4a8[0x2f] = auStackY_3d0[7];
    auStackY_4a8[0x10] = auStackY_3f8[0x10];
    auStackY_4a8[0x11] = auStackY_3f8[0x11];
    auStackY_4a8[0x12] = auStackY_3f8[0x12];
    auStackY_4a8[0x13] = auStackY_3f8[0x13];
    auStackY_4a8[0x14] = auStackY_3f8[0x14];
    auStackY_4a8[0x15] = auStackY_3f8[0x15];
    auStackY_4a8[0x16] = auStackY_3f8[0x16];
    auStackY_4a8[0x17] = auStackY_3f8[0x17];
    auStackY_4a8[0x18] = auStackY_3f8[0x18];
    auStackY_4a8[0x19] = auStackY_3f8[0x19];
    auStackY_4a8[0x1a] = auStackY_3f8[0x1a];
    auStackY_4a8[0x1b] = auStackY_3f8[0x1b];
    auStackY_4a8[0x1c] = auStackY_3f8[0x1c];
    auStackY_4a8[0x1d] = auStackY_3f8[0x1d];
    auStackY_4a8[0x1e] = auStackY_3f8[0x1e];
    auStackY_4a8[0x1f] = auStackY_3f8[0x1f];
    auStackY_4a8[0] = auStackY_3f8[0];
    auStackY_4a8[1] = auStackY_3f8[1];
    auStackY_4a8[2] = auStackY_3f8[2];
    auStackY_4a8[3] = auStackY_3f8[3];
    auStackY_4a8[4] = auStackY_3f8[4];
    auStackY_4a8[5] = auStackY_3f8[5];
    auStackY_4a8[6] = auStackY_3f8[6];
    auStackY_4a8[7] = auStackY_3f8[7];
    auStackY_4a8[8] = auStackY_3f8[8];
    auStackY_4a8[9] = auStackY_3f8[9];
    auStackY_4a8[10] = auStackY_3f8[10];
    auStackY_4a8[0xb] = auStackY_3f8[0xb];
    auStackY_4a8[0xc] = auStackY_3f8[0xc];
    auStackY_4a8[0xd] = auStackY_3f8[0xd];
    auStackY_4a8[0xe] = auStackY_3f8[0xe];
    auStackY_4a8[0xf] = auStackY_3f8[0xf];
    auStackY_4b8 = auStackY_408;
    psStackY_4b0 = psStackY_400;
    iVar3 = secp256k1_ec_pubkey_tweak_mul(CTX,(secp256k1_pubkey *)auStackY_4b8,abStackY_388);
    if (iVar3 != 0) goto LAB_0013f791;
    lVar10 = 0;
    do {
      iVar3 = (uint)(byte)auStackY_4b8[lVar10] - (uint)(byte)auStackY_3c8[lVar10];
      if (auStackY_4b8[lVar10] != auStackY_3c8[lVar10]) goto LAB_0013e79e;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x40);
    iVar3 = 0;
LAB_0013e79e:
    if (iVar3 != 0) goto LAB_0013f796;
    auStackY_4a8[0x20] = auStackY_3f8[0x20];
    auStackY_4a8[0x21] = auStackY_3f8[0x21];
    auStackY_4a8[0x22] = auStackY_3f8[0x22];
    auStackY_4a8[0x23] = auStackY_3f8[0x23];
    auStackY_4a8[0x24] = auStackY_3f8[0x24];
    auStackY_4a8[0x25] = auStackY_3f8[0x25];
    auStackY_4a8[0x26] = auStackY_3f8[0x26];
    auStackY_4a8[0x27] = auStackY_3f8[0x27];
    auStackY_4a8[0x28] = auStackY_3d0[0];
    auStackY_4a8[0x29] = auStackY_3d0[1];
    auStackY_4a8[0x2a] = auStackY_3d0[2];
    auStackY_4a8[0x2b] = auStackY_3d0[3];
    auStackY_4a8[0x2c] = auStackY_3d0[4];
    auStackY_4a8[0x2d] = auStackY_3d0[5];
    auStackY_4a8[0x2e] = auStackY_3d0[6];
    auStackY_4a8[0x2f] = auStackY_3d0[7];
    auStackY_4a8[0x10] = auStackY_3f8[0x10];
    auStackY_4a8[0x11] = auStackY_3f8[0x11];
    auStackY_4a8[0x12] = auStackY_3f8[0x12];
    auStackY_4a8[0x13] = auStackY_3f8[0x13];
    auStackY_4a8[0x14] = auStackY_3f8[0x14];
    auStackY_4a8[0x15] = auStackY_3f8[0x15];
    auStackY_4a8[0x16] = auStackY_3f8[0x16];
    auStackY_4a8[0x17] = auStackY_3f8[0x17];
    auStackY_4a8[0x18] = auStackY_3f8[0x18];
    auStackY_4a8[0x19] = auStackY_3f8[0x19];
    auStackY_4a8[0x1a] = auStackY_3f8[0x1a];
    auStackY_4a8[0x1b] = auStackY_3f8[0x1b];
    auStackY_4a8[0x1c] = auStackY_3f8[0x1c];
    auStackY_4a8[0x1d] = auStackY_3f8[0x1d];
    auStackY_4a8[0x1e] = auStackY_3f8[0x1e];
    auStackY_4a8[0x1f] = auStackY_3f8[0x1f];
    auStackY_4a8[0] = auStackY_3f8[0];
    auStackY_4a8[1] = auStackY_3f8[1];
    auStackY_4a8[2] = auStackY_3f8[2];
    auStackY_4a8[3] = auStackY_3f8[3];
    auStackY_4a8[4] = auStackY_3f8[4];
    auStackY_4a8[5] = auStackY_3f8[5];
    auStackY_4a8[6] = auStackY_3f8[6];
    auStackY_4a8[7] = auStackY_3f8[7];
    auStackY_4a8[8] = auStackY_3f8[8];
    auStackY_4a8[9] = auStackY_3f8[9];
    auStackY_4a8[10] = auStackY_3f8[10];
    auStackY_4a8[0xb] = auStackY_3f8[0xb];
    auStackY_4a8[0xc] = auStackY_3f8[0xc];
    auStackY_4a8[0xd] = auStackY_3f8[0xd];
    auStackY_4a8[0xe] = auStackY_3f8[0xe];
    auStackY_4a8[0xf] = auStackY_3f8[0xf];
    auStackY_4b8 = auStackY_408;
    psStackY_4b0 = psStackY_400;
    auStackY_460[8] = auStackY_380[8];
    auStackY_460[9] = auStackY_380[9];
    auStackY_460[10] = auStackY_380[10];
    auStackY_460[0xb] = auStackY_380[0xb];
    auStackY_460[0xc] = auStackY_380[0xc];
    auStackY_460[0xd] = auStackY_380[0xd];
    auStackY_460[0xe] = auStackY_380[0xe];
    auStackY_460[0xf] = auStackY_380[0xf];
    abStackY_468[0] = abStackY_388[0];
    abStackY_468[1] = abStackY_388[1];
    abStackY_468[2] = abStackY_388[2];
    abStackY_468[3] = abStackY_388[3];
    abStackY_468[4] = abStackY_388[4];
    abStackY_468[5] = abStackY_388[5];
    abStackY_468[6] = abStackY_388[6];
    abStackY_468[7] = abStackY_388[7];
    auStackY_460[0] = auStackY_380[0];
    auStackY_460[1] = auStackY_380[1];
    auStackY_460[2] = auStackY_380[2];
    auStackY_460[3] = auStackY_380[3];
    auStackY_460[4] = auStackY_380[4];
    auStackY_460[5] = auStackY_380[5];
    auStackY_460[6] = auStackY_380[6];
    auStackY_460[7] = auStackY_380[7];
    uStackY_450._0_7_ = (undefined7)auStackY_380._16_8_;
    uStackY_450._7_1_ = '@';
    abStackY_438[0x10] = 0;
    abStackY_438[0x11] = 0;
    abStackY_438[0x12] = 0;
    abStackY_438[0x13] = 0;
    abStackY_438[0x14] = 0;
    abStackY_438[0x15] = 0;
    abStackY_438[0x16] = 0;
    abStackY_438[0x17] = 0;
    abStackY_438[0] = 0;
    abStackY_438[1] = 0;
    abStackY_438[2] = 0;
    abStackY_438[3] = 0;
    abStackY_438[4] = 0;
    abStackY_438[5] = 0;
    abStackY_438[6] = 0;
    abStackY_438[7] = 0;
    abStackY_438[8] = 0;
    abStackY_438[9] = 0;
    abStackY_438[10] = 0;
    abStackY_438[0xb] = 0;
    abStackY_438[0xc] = 0;
    abStackY_438[0xd] = 0;
    abStackY_438[0xe] = 0;
    abStackY_438[0xf] = 0;
    abStackY_438[0x18] = 0;
    abStackY_438[0x19] = 0;
    abStackY_438[0x1a] = 0;
    abStackY_438[0x1b] = 0;
    abStackY_438[0x1c] = 0;
    abStackY_438[0x1d] = 0;
    abStackY_438[0x1e] = 0;
    abStackY_438[0x1f] = 1;
    iVar3 = secp256k1_ec_seckey_tweak_add(CTX,abStackY_438,abStackY_468);
    if (iVar3 != 0) goto LAB_0013f79b;
    lVar10 = 0;
    do {
      iVar3 = (uint)(byte)auStackY_3c8[lVar10] - (uint)abStackY_438[lVar10];
      if (auStackY_3c8[lVar10] != abStackY_438[lVar10]) goto LAB_0013e84f;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x20);
    iVar3 = 0;
LAB_0013e84f:
    if (iVar3 != 0) goto LAB_0013f7a0;
    abStackY_438[0x1f] = 1;
    iVar3 = secp256k1_ec_pubkey_tweak_add(CTX,(secp256k1_pubkey *)auStackY_4b8,abStackY_438);
    if (iVar3 != 0) goto LAB_0013f7a5;
    lVar10 = 0;
    do {
      iVar3 = (uint)(byte)auStackY_4b8[lVar10] - (uint)(byte)auStackY_3c8[lVar10];
      if (auStackY_4b8[lVar10] != auStackY_3c8[lVar10]) goto LAB_0013e8a4;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x40);
    iVar3 = 0;
LAB_0013e8a4:
    if (iVar3 != 0) goto LAB_0013f7aa;
    auStackY_4a8[0x20] = auStackY_3f8[0x20];
    auStackY_4a8[0x21] = auStackY_3f8[0x21];
    auStackY_4a8[0x22] = auStackY_3f8[0x22];
    auStackY_4a8[0x23] = auStackY_3f8[0x23];
    auStackY_4a8[0x24] = auStackY_3f8[0x24];
    auStackY_4a8[0x25] = auStackY_3f8[0x25];
    auStackY_4a8[0x26] = auStackY_3f8[0x26];
    auStackY_4a8[0x27] = auStackY_3f8[0x27];
    auStackY_4a8[0x28] = auStackY_3d0[0];
    auStackY_4a8[0x29] = auStackY_3d0[1];
    auStackY_4a8[0x2a] = auStackY_3d0[2];
    auStackY_4a8[0x2b] = auStackY_3d0[3];
    auStackY_4a8[0x2c] = auStackY_3d0[4];
    auStackY_4a8[0x2d] = auStackY_3d0[5];
    auStackY_4a8[0x2e] = auStackY_3d0[6];
    auStackY_4a8[0x2f] = auStackY_3d0[7];
    auStackY_4a8[0x10] = auStackY_3f8[0x10];
    auStackY_4a8[0x11] = auStackY_3f8[0x11];
    auStackY_4a8[0x12] = auStackY_3f8[0x12];
    auStackY_4a8[0x13] = auStackY_3f8[0x13];
    auStackY_4a8[0x14] = auStackY_3f8[0x14];
    auStackY_4a8[0x15] = auStackY_3f8[0x15];
    auStackY_4a8[0x16] = auStackY_3f8[0x16];
    auStackY_4a8[0x17] = auStackY_3f8[0x17];
    auStackY_4a8[0x18] = auStackY_3f8[0x18];
    auStackY_4a8[0x19] = auStackY_3f8[0x19];
    auStackY_4a8[0x1a] = auStackY_3f8[0x1a];
    auStackY_4a8[0x1b] = auStackY_3f8[0x1b];
    auStackY_4a8[0x1c] = auStackY_3f8[0x1c];
    auStackY_4a8[0x1d] = auStackY_3f8[0x1d];
    auStackY_4a8[0x1e] = auStackY_3f8[0x1e];
    auStackY_4a8[0x1f] = auStackY_3f8[0x1f];
    auStackY_4a8[0] = auStackY_3f8[0];
    auStackY_4a8[1] = auStackY_3f8[1];
    auStackY_4a8[2] = auStackY_3f8[2];
    auStackY_4a8[3] = auStackY_3f8[3];
    auStackY_4a8[4] = auStackY_3f8[4];
    auStackY_4a8[5] = auStackY_3f8[5];
    auStackY_4a8[6] = auStackY_3f8[6];
    auStackY_4a8[7] = auStackY_3f8[7];
    auStackY_4a8[8] = auStackY_3f8[8];
    auStackY_4a8[9] = auStackY_3f8[9];
    auStackY_4a8[10] = auStackY_3f8[10];
    auStackY_4a8[0xb] = auStackY_3f8[0xb];
    auStackY_4a8[0xc] = auStackY_3f8[0xc];
    auStackY_4a8[0xd] = auStackY_3f8[0xd];
    auStackY_4a8[0xe] = auStackY_3f8[0xe];
    auStackY_4a8[0xf] = auStackY_3f8[0xf];
    auStackY_4b8 = auStackY_408;
    psStackY_4b0 = psStackY_400;
    abStackY_438[0x1f] = 2;
    iVar3 = secp256k1_ec_seckey_tweak_add(CTX,abStackY_438,abStackY_468);
    if (iVar3 == 0) goto LAB_0013f7af;
    lVar10 = 0;
    do {
      iVar3 = (uint)abStackY_438[lVar10] - (uint)(byte)auStackY_3c8[lVar10];
      if (abStackY_438[lVar10] != auStackY_3c8[lVar10]) goto LAB_0013e930;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x1f);
    iVar3 = 0;
LAB_0013e930:
    if ((iVar3 != 0) || (abStackY_438[0x1f] != '\x01')) goto LAB_0013f7b4;
    abStackY_438[0x1f] = 2;
    iVar3 = secp256k1_ec_pubkey_tweak_add(CTX,(secp256k1_pubkey *)auStackY_4b8,abStackY_438);
    if (iVar3 == 0) goto LAB_0013f7b9;
    abStackY_438[0x1f] = 1;
    iVar3 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)auStackY_408,abStackY_438);
    if (iVar3 == 0) goto LAB_0013f7be;
    lVar10 = 0;
    do {
      iVar3 = (uint)(byte)auStackY_4b8[lVar10] - (uint)(byte)auStackY_408[lVar10];
      if (auStackY_4b8[lVar10] != auStackY_408[lVar10]) goto LAB_0013e9bb;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x40);
    iVar3 = 0;
LAB_0013e9bb:
    if (iVar3 != 0) goto LAB_0013f7c3;
    iVar3 = secp256k1_ec_pubkey_tweak_add(CTX,(secp256k1_pubkey *)auStackY_4b8,abStackY_438);
    if (iVar3 == 0) goto LAB_0013f7c8;
    abStackY_438[0x1f] = 2;
    iVar3 = secp256k1_ec_pubkey_tweak_mul(CTX,(secp256k1_pubkey *)auStackY_408,abStackY_438);
    psVar8 = CTX;
    if (iVar3 == 0) goto LAB_0013f7cd;
    lVar10 = 0;
    do {
      iVar3 = (uint)(byte)auStackY_4b8[lVar10] - (uint)(byte)auStackY_408[lVar10];
      if (auStackY_4b8[lVar10] != auStackY_408[lVar10]) goto LAB_0013ea34;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x40);
    iVar3 = 0;
LAB_0013ea34:
    if (iVar3 != 0) goto LAB_0013f7d2;
    iStackY_4c4 = 0;
    if (secp256k1_context_static == CTX) goto LAB_0013f7d7;
    (CTX->illegal_callback).fn = counting_illegal_callback_fn;
    (psVar8->illegal_callback).data = &iStackY_4c4;
  }
  else {
LAB_0013f6dd:
    run_eckey_edge_case_test_cold_3();
LAB_0013f6e2:
    run_eckey_edge_case_test_cold_4();
LAB_0013f6e7:
    run_eckey_edge_case_test_cold_5();
LAB_0013f6ec:
    run_eckey_edge_case_test_cold_6();
LAB_0013f6f1:
    run_eckey_edge_case_test_cold_7();
LAB_0013f6f6:
    run_eckey_edge_case_test_cold_8();
LAB_0013f6fb:
    run_eckey_edge_case_test_cold_9();
LAB_0013f700:
    run_eckey_edge_case_test_cold_111();
LAB_0013f705:
    run_eckey_edge_case_test_cold_110();
LAB_0013f70a:
    run_eckey_edge_case_test_cold_109();
LAB_0013f70f:
    run_eckey_edge_case_test_cold_10();
LAB_0013f714:
    run_eckey_edge_case_test_cold_11();
LAB_0013f719:
    run_eckey_edge_case_test_cold_12();
LAB_0013f71e:
    run_eckey_edge_case_test_cold_108();
LAB_0013f723:
    run_eckey_edge_case_test_cold_107();
LAB_0013f728:
    run_eckey_edge_case_test_cold_106();
LAB_0013f72d:
    run_eckey_edge_case_test_cold_105();
LAB_0013f732:
    run_eckey_edge_case_test_cold_104();
LAB_0013f737:
    run_eckey_edge_case_test_cold_103();
LAB_0013f73c:
    run_eckey_edge_case_test_cold_13();
LAB_0013f741:
    run_eckey_edge_case_test_cold_14();
LAB_0013f746:
    run_eckey_edge_case_test_cold_15();
LAB_0013f74b:
    run_eckey_edge_case_test_cold_16();
LAB_0013f750:
    run_eckey_edge_case_test_cold_17();
LAB_0013f755:
    run_eckey_edge_case_test_cold_102();
LAB_0013f75a:
    run_eckey_edge_case_test_cold_18();
LAB_0013f75f:
    run_eckey_edge_case_test_cold_19();
LAB_0013f764:
    run_eckey_edge_case_test_cold_20();
LAB_0013f769:
    run_eckey_edge_case_test_cold_21();
LAB_0013f76e:
    run_eckey_edge_case_test_cold_22();
LAB_0013f773:
    run_eckey_edge_case_test_cold_23();
LAB_0013f778:
    run_eckey_edge_case_test_cold_24();
LAB_0013f77d:
    run_eckey_edge_case_test_cold_25();
LAB_0013f782:
    run_eckey_edge_case_test_cold_26();
LAB_0013f787:
    run_eckey_edge_case_test_cold_27();
LAB_0013f78c:
    run_eckey_edge_case_test_cold_28();
LAB_0013f791:
    run_eckey_edge_case_test_cold_29();
LAB_0013f796:
    run_eckey_edge_case_test_cold_30();
LAB_0013f79b:
    run_eckey_edge_case_test_cold_31();
LAB_0013f7a0:
    run_eckey_edge_case_test_cold_32();
LAB_0013f7a5:
    run_eckey_edge_case_test_cold_33();
LAB_0013f7aa:
    run_eckey_edge_case_test_cold_34();
LAB_0013f7af:
    run_eckey_edge_case_test_cold_101();
LAB_0013f7b4:
    run_eckey_edge_case_test_cold_100();
LAB_0013f7b9:
    run_eckey_edge_case_test_cold_99();
LAB_0013f7be:
    run_eckey_edge_case_test_cold_98();
LAB_0013f7c3:
    run_eckey_edge_case_test_cold_35();
LAB_0013f7c8:
    run_eckey_edge_case_test_cold_97();
LAB_0013f7cd:
    run_eckey_edge_case_test_cold_96();
LAB_0013f7d2:
    run_eckey_edge_case_test_cold_36();
    psVar8 = extraout_RAX_07;
LAB_0013f7d7:
    (*(psVar8->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar8->illegal_callback).data);
  }
  if (iStackY_4c4 == 0) {
    auStackY_4a8[0] = '\0';
    auStackY_4a8[1] = '\0';
    auStackY_4a8[2] = '\0';
    auStackY_4a8[3] = '\0';
    auStackY_4a8[4] = '\0';
    auStackY_4a8[5] = '\0';
    auStackY_4a8[6] = '\0';
    auStackY_4a8[7] = '\0';
    auStackY_4a8[8] = '\0';
    auStackY_4a8[9] = '\0';
    auStackY_4a8[10] = '\0';
    auStackY_4a8[0xb] = '\0';
    auStackY_4a8[0xc] = '\0';
    auStackY_4a8[0xd] = '\0';
    auStackY_4a8[0xe] = '\0';
    auStackY_4a8[0xf] = '\0';
    auStackY_4b8[0] = '\0';
    auStackY_4b8[1] = '\0';
    auStackY_4b8[2] = '\0';
    auStackY_4b8[3] = '\0';
    auStackY_4b8[4] = '\0';
    auStackY_4b8[5] = '\0';
    auStackY_4b8[6] = '\0';
    auStackY_4b8[7] = '\0';
    psStackY_4b0 = (secp256k1_pubkey *)0x0;
    iVar3 = secp256k1_ec_pubkey_tweak_add(CTX,(secp256k1_pubkey *)auStackY_4b8,abStackY_438);
    if (iVar3 != 0) goto LAB_0013f7f5;
    if (iStackY_4c4 != 1) goto LAB_0013f7fa;
    lVar10 = 0;
    do {
      iVar3 = (uint)(byte)auStackY_4b8[lVar10] - (uint)(byte)auStackY_3c8[lVar10];
      if (auStackY_4b8[lVar10] != auStackY_3c8[lVar10]) goto LAB_0013eadb;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x40);
    iVar3 = 0;
LAB_0013eadb:
    if (iVar3 != 0) goto LAB_0013f7ff;
    auStackY_4a8[0x20] = auStackY_3f8[0x20];
    auStackY_4a8[0x21] = auStackY_3f8[0x21];
    auStackY_4a8[0x22] = auStackY_3f8[0x22];
    auStackY_4a8[0x23] = auStackY_3f8[0x23];
    auStackY_4a8[0x24] = auStackY_3f8[0x24];
    auStackY_4a8[0x25] = auStackY_3f8[0x25];
    auStackY_4a8[0x26] = auStackY_3f8[0x26];
    auStackY_4a8[0x27] = auStackY_3f8[0x27];
    auStackY_4a8[0x28] = auStackY_3d0[0];
    auStackY_4a8[0x29] = auStackY_3d0[1];
    auStackY_4a8[0x2a] = auStackY_3d0[2];
    auStackY_4a8[0x2b] = auStackY_3d0[3];
    auStackY_4a8[0x2c] = auStackY_3d0[4];
    auStackY_4a8[0x2d] = auStackY_3d0[5];
    auStackY_4a8[0x2e] = auStackY_3d0[6];
    auStackY_4a8[0x2f] = auStackY_3d0[7];
    auStackY_4a8[0x10] = auStackY_3f8[0x10];
    auStackY_4a8[0x11] = auStackY_3f8[0x11];
    auStackY_4a8[0x12] = auStackY_3f8[0x12];
    auStackY_4a8[0x13] = auStackY_3f8[0x13];
    auStackY_4a8[0x14] = auStackY_3f8[0x14];
    auStackY_4a8[0x15] = auStackY_3f8[0x15];
    auStackY_4a8[0x16] = auStackY_3f8[0x16];
    auStackY_4a8[0x17] = auStackY_3f8[0x17];
    auStackY_4a8[0x18] = auStackY_3f8[0x18];
    auStackY_4a8[0x19] = auStackY_3f8[0x19];
    auStackY_4a8[0x1a] = auStackY_3f8[0x1a];
    auStackY_4a8[0x1b] = auStackY_3f8[0x1b];
    auStackY_4a8[0x1c] = auStackY_3f8[0x1c];
    auStackY_4a8[0x1d] = auStackY_3f8[0x1d];
    auStackY_4a8[0x1e] = auStackY_3f8[0x1e];
    auStackY_4a8[0x1f] = auStackY_3f8[0x1f];
    auStackY_4a8[0] = auStackY_3f8[0];
    auStackY_4a8[1] = auStackY_3f8[1];
    auStackY_4a8[2] = auStackY_3f8[2];
    auStackY_4a8[3] = auStackY_3f8[3];
    auStackY_4a8[4] = auStackY_3f8[4];
    auStackY_4a8[5] = auStackY_3f8[5];
    auStackY_4a8[6] = auStackY_3f8[6];
    auStackY_4a8[7] = auStackY_3f8[7];
    auStackY_4a8[8] = auStackY_3f8[8];
    auStackY_4a8[9] = auStackY_3f8[9];
    auStackY_4a8[10] = auStackY_3f8[10];
    auStackY_4a8[0xb] = auStackY_3f8[0xb];
    auStackY_4a8[0xc] = auStackY_3f8[0xc];
    auStackY_4a8[0xd] = auStackY_3f8[0xd];
    auStackY_4a8[0xe] = auStackY_3f8[0xe];
    auStackY_4a8[0xf] = auStackY_3f8[0xf];
    auStackY_4b8 = auStackY_408;
    psStackY_4b0 = psStackY_400;
    auStackY_408[0] = '\0';
    auStackY_408[1] = '\0';
    auStackY_408[2] = '\0';
    auStackY_408[3] = '\0';
    auStackY_408[4] = '\0';
    auStackY_408[5] = '\0';
    auStackY_408[6] = '\0';
    auStackY_408[7] = '\0';
    psStackY_400 = (secp256k1_pubkey *)0x0;
    auStackY_3f8[0] = '\0';
    auStackY_3f8[1] = '\0';
    auStackY_3f8[2] = '\0';
    auStackY_3f8[3] = '\0';
    auStackY_3f8[4] = '\0';
    auStackY_3f8[5] = '\0';
    auStackY_3f8[6] = '\0';
    auStackY_3f8[7] = '\0';
    auStackY_3f8[8] = '\0';
    auStackY_3f8[9] = '\0';
    auStackY_3f8[10] = '\0';
    auStackY_3f8[0xb] = '\0';
    auStackY_3f8[0xc] = '\0';
    auStackY_3f8[0xd] = '\0';
    auStackY_3f8[0xe] = '\0';
    auStackY_3f8[0xf] = '\0';
    iVar3 = secp256k1_ec_pubkey_tweak_mul(CTX,(secp256k1_pubkey *)auStackY_408,abStackY_438);
    if (iVar3 != 0) goto LAB_0013f804;
    if (iStackY_4c4 != 2) goto LAB_0013f809;
    lVar10 = 0;
    do {
      iVar3 = (uint)(byte)auStackY_408[lVar10] - (uint)(byte)auStackY_3c8[lVar10];
      if (auStackY_408[lVar10] != auStackY_3c8[lVar10]) goto LAB_0013eb6a;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x40);
    iVar3 = 0;
LAB_0013eb6a:
    if (iVar3 != 0) goto LAB_0013f80e;
    iStackY_4c4 = 0;
    iVar3 = secp256k1_ec_seckey_verify(CTX,abStackY_468);
    if (iVar3 == 0) goto LAB_0013f813;
    if (iStackY_4c4 != 0) goto LAB_0013f818;
    iVar3 = secp256k1_ec_seckey_verify(CTX,(uchar *)0x0);
    if (iVar3 != 0) goto LAB_0013f81d;
    if (iStackY_4c4 != 1) goto LAB_0013f822;
    iStackY_4c4 = 0;
    abStackY_438[0x10] = 0;
    abStackY_438[0x11] = 0;
    abStackY_438[0x12] = 0;
    abStackY_438[0x13] = 0;
    abStackY_438[0x14] = 0;
    abStackY_438[0x15] = 0;
    abStackY_438[0x16] = 0;
    abStackY_438[0x17] = 0;
    abStackY_438[0] = 0;
    abStackY_438[1] = 0;
    abStackY_438[2] = 0;
    abStackY_438[3] = 0;
    abStackY_438[4] = 0;
    abStackY_438[5] = 0;
    abStackY_438[6] = 0;
    abStackY_438[7] = 0;
    abStackY_438[8] = 0;
    abStackY_438[9] = 0;
    abStackY_438[10] = 0;
    abStackY_438[0xb] = 0;
    abStackY_438[0xc] = 0;
    abStackY_438[0xd] = 0;
    abStackY_438[0xe] = 0;
    abStackY_438[0xf] = 0;
    abStackY_438[0x18] = 0;
    abStackY_438[0x19] = 0;
    abStackY_438[0x1a] = 0;
    abStackY_438[0x1b] = 0;
    abStackY_438[0x1c] = 0;
    abStackY_438[0x1d] = 0;
    abStackY_438[0x1e] = 0;
    abStackY_438[0x1f] = 4;
    iVar3 = secp256k1_ec_pubkey_tweak_add(CTX,(secp256k1_pubkey *)0x0,abStackY_438);
    if (iVar3 != 0) goto LAB_0013f827;
    if (iStackY_4c4 != 1) goto LAB_0013f82c;
    iVar3 = secp256k1_ec_pubkey_tweak_add(CTX,(secp256k1_pubkey *)auStackY_4b8,(uchar *)0x0);
    if (iVar3 != 0) goto LAB_0013f831;
    if (iStackY_4c4 != 2) goto LAB_0013f836;
    iStackY_4c4 = 0;
    abStackY_438[0x10] = 0;
    abStackY_438[0x11] = 0;
    abStackY_438[0x12] = 0;
    abStackY_438[0x13] = 0;
    abStackY_438[0x14] = 0;
    abStackY_438[0x15] = 0;
    abStackY_438[0x16] = 0;
    abStackY_438[0x17] = 0;
    abStackY_438[0] = 0;
    abStackY_438[1] = 0;
    abStackY_438[2] = 0;
    abStackY_438[3] = 0;
    abStackY_438[4] = 0;
    abStackY_438[5] = 0;
    abStackY_438[6] = 0;
    abStackY_438[7] = 0;
    abStackY_438[8] = 0;
    abStackY_438[9] = 0;
    abStackY_438[10] = 0;
    abStackY_438[0xb] = 0;
    abStackY_438[0xc] = 0;
    abStackY_438[0xd] = 0;
    abStackY_438[0xe] = 0;
    abStackY_438[0xf] = 0;
    abStackY_438[0x18] = 0;
    abStackY_438[0x19] = 0;
    abStackY_438[0x1a] = 0;
    abStackY_438[0x1b] = 0;
    abStackY_438[0x1c] = 0;
    abStackY_438[0x1d] = 0;
    abStackY_438[0x1e] = 0;
    abStackY_438[0x1f] = 4;
    iVar3 = secp256k1_ec_pubkey_tweak_mul(CTX,(secp256k1_pubkey *)0x0,abStackY_438);
    if (iVar3 != 0) goto LAB_0013f83b;
    if (iStackY_4c4 != 1) goto LAB_0013f840;
    iVar3 = secp256k1_ec_pubkey_tweak_mul(CTX,(secp256k1_pubkey *)auStackY_4b8,(uchar *)0x0);
    if (iVar3 != 0) goto LAB_0013f845;
    if (iStackY_4c4 != 2) goto LAB_0013f84a;
    iStackY_4c4 = 0;
    abStackY_438[0] = 0;
    abStackY_438[1] = 0;
    abStackY_438[2] = 0;
    abStackY_438[3] = 0;
    abStackY_438[4] = 0;
    abStackY_438[5] = 0;
    abStackY_438[6] = 0;
    abStackY_438[7] = 0;
    abStackY_438[8] = 0;
    abStackY_438[9] = 0;
    abStackY_438[10] = 0;
    abStackY_438[0xb] = 0;
    abStackY_438[0xc] = 0;
    abStackY_438[0xd] = 0;
    abStackY_438[0xe] = 0;
    abStackY_438[0xf] = 0;
    abStackY_438[0x10] = 0;
    abStackY_438[0x11] = 0;
    abStackY_438[0x12] = 0;
    abStackY_438[0x13] = 0;
    abStackY_438[0x14] = 0;
    abStackY_438[0x15] = 0;
    abStackY_438[0x16] = 0;
    abStackY_438[0x17] = 0;
    abStackY_438[0x18] = 0;
    abStackY_438[0x19] = 0;
    abStackY_438[0x1a] = 0;
    abStackY_438[0x1b] = 0;
    abStackY_438[0x1c] = 0;
    abStackY_438[0x1d] = 0;
    abStackY_438[0x1e] = 0;
    abStackY_438[0x1f] = 0;
    iVar3 = secp256k1_ec_seckey_tweak_add(CTX,(uchar *)0x0,abStackY_438);
    if (iVar3 != 0) goto LAB_0013f84f;
    if (iStackY_4c4 != 1) goto LAB_0013f854;
    iVar3 = secp256k1_ec_seckey_tweak_add(CTX,abStackY_468,(uchar *)0x0);
    if (iVar3 != 0) goto LAB_0013f859;
    if (iStackY_4c4 != 2) goto LAB_0013f85e;
    iStackY_4c4 = 0;
    abStackY_438[0x10] = 0;
    abStackY_438[0x11] = 0;
    abStackY_438[0x12] = 0;
    abStackY_438[0x13] = 0;
    abStackY_438[0x14] = 0;
    abStackY_438[0x15] = 0;
    abStackY_438[0x16] = 0;
    abStackY_438[0x17] = 0;
    abStackY_438[0] = 0;
    abStackY_438[1] = 0;
    abStackY_438[2] = 0;
    abStackY_438[3] = 0;
    abStackY_438[4] = 0;
    abStackY_438[5] = 0;
    abStackY_438[6] = 0;
    abStackY_438[7] = 0;
    abStackY_438[8] = 0;
    abStackY_438[9] = 0;
    abStackY_438[10] = 0;
    abStackY_438[0xb] = 0;
    abStackY_438[0xc] = 0;
    abStackY_438[0xd] = 0;
    abStackY_438[0xe] = 0;
    abStackY_438[0xf] = 0;
    abStackY_438[0x18] = 0;
    abStackY_438[0x19] = 0;
    abStackY_438[0x1a] = 0;
    abStackY_438[0x1b] = 0;
    abStackY_438[0x1c] = 0;
    abStackY_438[0x1d] = 0;
    abStackY_438[0x1e] = 0;
    abStackY_438[0x1f] = 1;
    iVar3 = secp256k1_ec_seckey_tweak_mul(CTX,(uchar *)0x0,abStackY_438);
    if (iVar3 != 0) goto LAB_0013f863;
    if (iStackY_4c4 != 1) goto LAB_0013f868;
    iVar3 = secp256k1_ec_seckey_tweak_mul(CTX,abStackY_468,(uchar *)0x0);
    if (iVar3 != 0) goto LAB_0013f86d;
    if (iStackY_4c4 != 2) goto LAB_0013f872;
    iStackY_4c4 = 0;
    iVar3 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)0x0,abStackY_468);
    if (iVar3 != 0) goto LAB_0013f877;
    if (iStackY_4c4 != 1) goto LAB_0013f87c;
    builtin_memcpy(auStackY_4a8 + 0x20,
                   "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
    builtin_memcpy(auStackY_4a8 + 0x10,
                   "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
    builtin_memcpy(auStackY_4a8,"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",
                   0x10);
    auStackY_4b8[0] = '\x01';
    auStackY_4b8[1] = '\x01';
    auStackY_4b8[2] = '\x01';
    auStackY_4b8[3] = '\x01';
    auStackY_4b8[4] = '\x01';
    auStackY_4b8[5] = '\x01';
    auStackY_4b8[6] = '\x01';
    auStackY_4b8[7] = '\x01';
    psStackY_4b0 = (secp256k1_pubkey *)0x101010101010101;
    iVar3 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)auStackY_4b8,(uchar *)0x0);
    if (iVar3 != 0) goto LAB_0013f881;
    if (iStackY_4c4 != 2) goto LAB_0013f886;
    lVar10 = 0;
    do {
      iVar3 = (uint)(byte)auStackY_4b8[lVar10] - (uint)(byte)auStackY_3c8[lVar10];
      if (auStackY_4b8[lVar10] != auStackY_3c8[lVar10]) goto LAB_0013ede9;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x40);
    iVar3 = 0;
LAB_0013ede9:
    if (iVar3 != 0) goto LAB_0013f88b;
    iStackY_4c4 = 0;
    auStackY_4b8[0] = 0xff;
    auStackY_4b8[1] = 0xff;
    auStackY_4b8[2] = 0xff;
    auStackY_4b8[3] = 0xff;
    auStackY_4b8[4] = 0xff;
    auStackY_4b8[5] = 0xff;
    auStackY_4b8[6] = 0xff;
    auStackY_4b8[7] = 0xff;
    psStackY_4b0 = (secp256k1_pubkey *)0xffffffffffffffff;
    auStackY_4a8[0] = 0xff;
    auStackY_4a8[1] = 0xff;
    auStackY_4a8[2] = 0xff;
    auStackY_4a8[3] = 0xff;
    auStackY_4a8[4] = 0xff;
    auStackY_4a8[5] = 0xff;
    auStackY_4a8[6] = 0xff;
    auStackY_4a8[7] = 0xff;
    auStackY_4a8[8] = 0xff;
    auStackY_4a8[9] = 0xff;
    auStackY_4a8[10] = 0xff;
    auStackY_4a8[0xb] = 0xff;
    auStackY_4a8[0xc] = 0xff;
    auStackY_4a8[0xd] = 0xff;
    auStackY_4a8[0xe] = 0xff;
    auStackY_4a8[0xf] = 0xff;
    auStackY_4a8[0x10] = 0xff;
    auStackY_4a8[0x11] = 0xff;
    auStackY_4a8[0x12] = 0xff;
    auStackY_4a8[0x13] = 0xff;
    auStackY_4a8[0x14] = 0xff;
    auStackY_4a8[0x15] = 0xff;
    auStackY_4a8[0x16] = 0xff;
    auStackY_4a8[0x17] = 0xff;
    auStackY_4a8[0x18] = 0xff;
    auStackY_4a8[0x19] = 0xff;
    auStackY_4a8[0x1a] = 0xff;
    auStackY_4a8[0x1b] = 0xff;
    auStackY_4a8[0x1c] = 0xff;
    auStackY_4a8[0x1d] = 0xff;
    auStackY_4a8[0x1e] = 0xff;
    auStackY_4a8[0x1f] = 0xff;
    auStackY_4a8[0x20] = 0xff;
    auStackY_4a8[0x21] = 0xff;
    auStackY_4a8[0x22] = 0xff;
    auStackY_4a8[0x23] = 0xff;
    auStackY_4a8[0x24] = 0xff;
    auStackY_4a8[0x25] = 0xff;
    auStackY_4a8[0x26] = 0xff;
    auStackY_4a8[0x27] = 0xff;
    auStackY_4a8[0x28] = 0xff;
    auStackY_4a8[0x29] = 0xff;
    auStackY_4a8[0x2a] = 0xff;
    auStackY_4a8[0x2b] = 0xff;
    auStackY_4a8[0x2c] = 0xff;
    auStackY_4a8[0x2d] = 0xff;
    auStackY_4a8[0x2e] = 0xff;
    auStackY_4a8[0x2f] = 0xff;
    uStackY_328 = 0x4d430001;
    uStackY_318 = 0x40;
    uStackY_310 = 0;
    uStackY_308 = 0;
    uStackY_300 = 0;
    sStackY_4c0 = 0;
    psStackY_320 = (secp256k1_pubkey *)auStackY_4b8;
    psStackY_2f8 = (secp256k1_pubkey *)auStackY_368;
    iVar3 = secp256k1_ec_pubkey_combine(CTX,(secp256k1_pubkey *)auStackY_4b8,&psStackY_2f8,0);
    if (iVar3 != 0) goto LAB_0013f890;
    uStackY_328 = 0x4d430005;
    uStackY_318 = 0x40;
    lVar10 = 0;
    uStackY_310 = 0;
    uStackY_308 = 0;
    uStackY_300 = 0;
    sStackY_4c0 = 0;
    do {
      iVar3 = (uint)(byte)auStackY_4b8[lVar10] - (uint)(byte)auStackY_3c8[lVar10];
      if (auStackY_4b8[lVar10] != auStackY_3c8[lVar10]) goto LAB_0013efb1;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x40);
    iVar3 = 0;
LAB_0013efb1:
    psStackY_320 = (secp256k1_pubkey *)auStackY_4b8;
    if (iVar3 != 0) goto LAB_0013f895;
    if (iStackY_4c4 != 1) goto LAB_0013f89a;
    iVar3 = secp256k1_ec_pubkey_combine(CTX,(secp256k1_pubkey *)0x0,&psStackY_2f8,1);
    if (iVar3 != 0) goto LAB_0013f89f;
    lVar10 = 0;
    do {
      iVar3 = (uint)(byte)auStackY_4b8[lVar10] - (uint)(byte)auStackY_3c8[lVar10];
      if (auStackY_4b8[lVar10] != auStackY_3c8[lVar10]) goto LAB_0013f00f;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x40);
    iVar3 = 0;
LAB_0013f00f:
    if (iVar3 != 0) goto LAB_0013f8a4;
    if (iStackY_4c4 != 2) goto LAB_0013f8a9;
    auStackY_4a8[0x20] = 0xff;
    auStackY_4a8[0x21] = 0xff;
    auStackY_4a8[0x22] = 0xff;
    auStackY_4a8[0x23] = 0xff;
    auStackY_4a8[0x24] = 0xff;
    auStackY_4a8[0x25] = 0xff;
    auStackY_4a8[0x26] = 0xff;
    auStackY_4a8[0x27] = 0xff;
    auStackY_4a8[0x28] = 0xff;
    auStackY_4a8[0x29] = 0xff;
    auStackY_4a8[0x2a] = 0xff;
    auStackY_4a8[0x2b] = 0xff;
    auStackY_4a8[0x2c] = 0xff;
    auStackY_4a8[0x2d] = 0xff;
    auStackY_4a8[0x2e] = 0xff;
    auStackY_4a8[0x2f] = 0xff;
    auStackY_4a8[0x10] = 0xff;
    auStackY_4a8[0x11] = 0xff;
    auStackY_4a8[0x12] = 0xff;
    auStackY_4a8[0x13] = 0xff;
    auStackY_4a8[0x14] = 0xff;
    auStackY_4a8[0x15] = 0xff;
    auStackY_4a8[0x16] = 0xff;
    auStackY_4a8[0x17] = 0xff;
    auStackY_4a8[0x18] = 0xff;
    auStackY_4a8[0x19] = 0xff;
    auStackY_4a8[0x1a] = 0xff;
    auStackY_4a8[0x1b] = 0xff;
    auStackY_4a8[0x1c] = 0xff;
    auStackY_4a8[0x1d] = 0xff;
    auStackY_4a8[0x1e] = 0xff;
    auStackY_4a8[0x1f] = 0xff;
    auStackY_4a8[0] = 0xff;
    auStackY_4a8[1] = 0xff;
    auStackY_4a8[2] = 0xff;
    auStackY_4a8[3] = 0xff;
    auStackY_4a8[4] = 0xff;
    auStackY_4a8[5] = 0xff;
    auStackY_4a8[6] = 0xff;
    auStackY_4a8[7] = 0xff;
    auStackY_4a8[8] = 0xff;
    auStackY_4a8[9] = 0xff;
    auStackY_4a8[10] = 0xff;
    auStackY_4a8[0xb] = 0xff;
    auStackY_4a8[0xc] = 0xff;
    auStackY_4a8[0xd] = 0xff;
    auStackY_4a8[0xe] = 0xff;
    auStackY_4a8[0xf] = 0xff;
    auStackY_4b8[0] = 0xff;
    auStackY_4b8[1] = 0xff;
    auStackY_4b8[2] = 0xff;
    auStackY_4b8[3] = 0xff;
    auStackY_4b8[4] = 0xff;
    auStackY_4b8[5] = 0xff;
    auStackY_4b8[6] = 0xff;
    auStackY_4b8[7] = 0xff;
    psStackY_4b0 = (secp256k1_pubkey *)0xffffffffffffffff;
    uStackY_328 = 0x4d430001;
    uStackY_318 = 0x40;
    uStackY_310 = 0;
    uStackY_308 = 0;
    uStackY_300 = 0;
    sStackY_4c0 = 0;
    psStackY_320 = (secp256k1_pubkey *)auStackY_4b8;
    iVar3 = secp256k1_ec_pubkey_combine
                      (CTX,(secp256k1_pubkey *)auStackY_4b8,(secp256k1_pubkey **)0x0,1);
    if (iVar3 != 0) goto LAB_0013f8ae;
    uStackY_328 = 0x4d430005;
    uStackY_318 = 0x40;
    lVar10 = 0;
    uStackY_310 = 0;
    uStackY_308 = 0;
    uStackY_300 = 0;
    sStackY_4c0 = 0;
    do {
      iVar3 = (uint)(byte)auStackY_4b8[lVar10] - (uint)(byte)auStackY_3c8[lVar10];
      if (auStackY_4b8[lVar10] != auStackY_3c8[lVar10]) goto LAB_0013f112;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x40);
    iVar3 = 0;
LAB_0013f112:
    psStackY_320 = (secp256k1_pubkey *)auStackY_4b8;
    if (iVar3 != 0) goto LAB_0013f8b3;
    if (iStackY_4c4 != 3) goto LAB_0013f8b8;
    psStackY_2f8 = (secp256k1_pubkey *)auStackY_2d8;
    auStackY_4b8[0] = 0xff;
    auStackY_4b8[1] = 0xff;
    auStackY_4b8[2] = 0xff;
    auStackY_4b8[3] = 0xff;
    auStackY_4b8[4] = 0xff;
    auStackY_4b8[5] = 0xff;
    auStackY_4b8[6] = 0xff;
    auStackY_4b8[7] = 0xff;
    psStackY_4b0 = (secp256k1_pubkey *)0xffffffffffffffff;
    auStackY_4a8[0] = 0xff;
    auStackY_4a8[1] = 0xff;
    auStackY_4a8[2] = 0xff;
    auStackY_4a8[3] = 0xff;
    auStackY_4a8[4] = 0xff;
    auStackY_4a8[5] = 0xff;
    auStackY_4a8[6] = 0xff;
    auStackY_4a8[7] = 0xff;
    auStackY_4a8[8] = 0xff;
    auStackY_4a8[9] = 0xff;
    auStackY_4a8[10] = 0xff;
    auStackY_4a8[0xb] = 0xff;
    auStackY_4a8[0xc] = 0xff;
    auStackY_4a8[0xd] = 0xff;
    auStackY_4a8[0xe] = 0xff;
    auStackY_4a8[0xf] = 0xff;
    auStackY_4a8[0x10] = 0xff;
    auStackY_4a8[0x11] = 0xff;
    auStackY_4a8[0x12] = 0xff;
    auStackY_4a8[0x13] = 0xff;
    auStackY_4a8[0x14] = 0xff;
    auStackY_4a8[0x15] = 0xff;
    auStackY_4a8[0x16] = 0xff;
    auStackY_4a8[0x17] = 0xff;
    auStackY_4a8[0x18] = 0xff;
    auStackY_4a8[0x19] = 0xff;
    auStackY_4a8[0x1a] = 0xff;
    auStackY_4a8[0x1b] = 0xff;
    auStackY_4a8[0x1c] = 0xff;
    auStackY_4a8[0x1d] = 0xff;
    auStackY_4a8[0x1e] = 0xff;
    auStackY_4a8[0x1f] = 0xff;
    auStackY_4a8[0x20] = 0xff;
    auStackY_4a8[0x21] = 0xff;
    auStackY_4a8[0x22] = 0xff;
    auStackY_4a8[0x23] = 0xff;
    auStackY_4a8[0x24] = 0xff;
    auStackY_4a8[0x25] = 0xff;
    auStackY_4a8[0x26] = 0xff;
    auStackY_4a8[0x27] = 0xff;
    auStackY_4a8[0x28] = 0xff;
    auStackY_4a8[0x29] = 0xff;
    auStackY_4a8[0x2a] = 0xff;
    auStackY_4a8[0x2b] = 0xff;
    auStackY_4a8[0x2c] = 0xff;
    auStackY_4a8[0x2d] = 0xff;
    auStackY_4a8[0x2e] = 0xff;
    auStackY_4a8[0x2f] = 0xff;
    uStackY_328 = 0x4d430001;
    uStackY_318 = 0x40;
    uStackY_310 = 0;
    uStackY_308 = 0;
    uStackY_300 = 0;
    sStackY_4c0 = 0;
    iVar3 = secp256k1_ec_pubkey_combine(CTX,(secp256k1_pubkey *)auStackY_4b8,&psStackY_2f8,1);
    if (iVar3 == 0) goto LAB_0013f8bd;
    uStackY_328 = 0x4d430005;
    uStackY_318 = 0x40;
    lVar10 = 0;
    uStackY_310 = 0;
    uStackY_308 = 0;
    uStackY_300 = 0;
    sStackY_4c0 = 0;
    do {
      iVar3 = (uint)(byte)auStackY_4b8[lVar10] - (uint)(byte)auStackY_3c8[lVar10];
      if (auStackY_4b8[lVar10] != auStackY_3c8[lVar10]) goto LAB_0013f229;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x40);
    iVar3 = 0;
LAB_0013f229:
    psStackY_320 = (secp256k1_pubkey *)auStackY_4b8;
    if (iVar3 < 1) goto LAB_0013f8c2;
    if (iStackY_4c4 != 3) goto LAB_0013f8c7;
    sStackY_4c0 = 0x21;
    iVar3 = secp256k1_ec_pubkey_serialize
                      (CTX,abStackY_468,&sStackY_4c0,(secp256k1_pubkey *)auStackY_4b8,0x102);
    if (iVar3 == 0) goto LAB_0013f8cc;
    iVar3 = secp256k1_ec_pubkey_serialize
                      (CTX,abStackY_438,&sStackY_4c0,(secp256k1_pubkey *)auStackY_2d8,0x102);
    if (iVar3 == 0) goto LAB_0013f8d1;
    lVar10 = 0;
    do {
      iVar3 = (uint)abStackY_468[lVar10] - (uint)abStackY_438[lVar10];
      if (abStackY_468[lVar10] != abStackY_438[lVar10]) goto LAB_0013f2c9;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x21);
    iVar3 = 0;
LAB_0013f2c9:
    if (iVar3 != 0) goto LAB_0013f8d6;
    auStackY_4b8[0] = 0xff;
    auStackY_4b8[1] = 0xff;
    auStackY_4b8[2] = 0xff;
    auStackY_4b8[3] = 0xff;
    auStackY_4b8[4] = 0xff;
    auStackY_4b8[5] = 0xff;
    auStackY_4b8[6] = 0xff;
    auStackY_4b8[7] = 0xff;
    psStackY_4b0 = (secp256k1_pubkey *)0xffffffffffffffff;
    auStackY_4a8[0] = 0xff;
    auStackY_4a8[1] = 0xff;
    auStackY_4a8[2] = 0xff;
    auStackY_4a8[3] = 0xff;
    auStackY_4a8[4] = 0xff;
    auStackY_4a8[5] = 0xff;
    auStackY_4a8[6] = 0xff;
    auStackY_4a8[7] = 0xff;
    auStackY_4a8[8] = 0xff;
    auStackY_4a8[9] = 0xff;
    auStackY_4a8[10] = 0xff;
    auStackY_4a8[0xb] = 0xff;
    auStackY_4a8[0xc] = 0xff;
    auStackY_4a8[0xd] = 0xff;
    auStackY_4a8[0xe] = 0xff;
    auStackY_4a8[0xf] = 0xff;
    auStackY_4a8[0x10] = 0xff;
    auStackY_4a8[0x11] = 0xff;
    auStackY_4a8[0x12] = 0xff;
    auStackY_4a8[0x13] = 0xff;
    auStackY_4a8[0x14] = 0xff;
    auStackY_4a8[0x15] = 0xff;
    auStackY_4a8[0x16] = 0xff;
    auStackY_4a8[0x17] = 0xff;
    auStackY_4a8[0x18] = 0xff;
    auStackY_4a8[0x19] = 0xff;
    auStackY_4a8[0x1a] = 0xff;
    auStackY_4a8[0x1b] = 0xff;
    auStackY_4a8[0x1c] = 0xff;
    auStackY_4a8[0x1d] = 0xff;
    auStackY_4a8[0x1e] = 0xff;
    auStackY_4a8[0x1f] = 0xff;
    auStackY_4a8[0x20] = 0xff;
    auStackY_4a8[0x21] = 0xff;
    auStackY_4a8[0x22] = 0xff;
    auStackY_4a8[0x23] = 0xff;
    auStackY_4a8[0x24] = 0xff;
    auStackY_4a8[0x25] = 0xff;
    auStackY_4a8[0x26] = 0xff;
    auStackY_4a8[0x27] = 0xff;
    auStackY_4a8[0x28] = 0xff;
    auStackY_4a8[0x29] = 0xff;
    auStackY_4a8[0x2a] = 0xff;
    auStackY_4a8[0x2b] = 0xff;
    auStackY_4a8[0x2c] = 0xff;
    auStackY_4a8[0x2d] = 0xff;
    auStackY_4a8[0x2e] = 0xff;
    auStackY_4a8[0x2f] = 0xff;
    uStackY_328 = 0x4d430001;
    uStackY_318 = 0x40;
    uStackY_310 = 0;
    uStackY_308 = 0;
    uStackY_300 = 0;
    uStackY_470 = 0;
    psStackY_320 = (secp256k1_pubkey *)auStackY_4b8;
    psStackY_2f8 = (secp256k1_pubkey *)auStackY_368;
    psStackY_2f0 = (secp256k1_pubkey *)auStackY_2d8;
    iVar3 = secp256k1_ec_pubkey_combine(CTX,(secp256k1_pubkey *)auStackY_4b8,&psStackY_2f8,2);
    if (iVar3 != 0) goto LAB_0013f8db;
    uStackY_328 = 0x4d430005;
    uStackY_318 = 0x40;
    lVar10 = 0;
    uStackY_310 = 0;
    uStackY_308 = 0;
    uStackY_300 = 0;
    uStackY_470 = 0;
    do {
      iVar3 = (uint)(byte)auStackY_4b8[lVar10] - (uint)(byte)auStackY_3c8[lVar10];
      if (auStackY_4b8[lVar10] != auStackY_3c8[lVar10]) goto LAB_0013f3d1;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x40);
    iVar3 = 0;
LAB_0013f3d1:
    psStackY_320 = (secp256k1_pubkey *)auStackY_4b8;
    if (iVar3 != 0) goto LAB_0013f8e0;
    if (iStackY_4c4 != 3) goto LAB_0013f8e5;
    auStackY_4b8[0] = 0xff;
    auStackY_4b8[1] = 0xff;
    auStackY_4b8[2] = 0xff;
    auStackY_4b8[3] = 0xff;
    auStackY_4b8[4] = 0xff;
    auStackY_4b8[5] = 0xff;
    auStackY_4b8[6] = 0xff;
    auStackY_4b8[7] = 0xff;
    psStackY_4b0 = (secp256k1_pubkey *)0xffffffffffffffff;
    auStackY_4a8[0] = 0xff;
    auStackY_4a8[1] = 0xff;
    auStackY_4a8[2] = 0xff;
    auStackY_4a8[3] = 0xff;
    auStackY_4a8[4] = 0xff;
    auStackY_4a8[5] = 0xff;
    auStackY_4a8[6] = 0xff;
    auStackY_4a8[7] = 0xff;
    auStackY_4a8[8] = 0xff;
    auStackY_4a8[9] = 0xff;
    auStackY_4a8[10] = 0xff;
    auStackY_4a8[0xb] = 0xff;
    auStackY_4a8[0xc] = 0xff;
    auStackY_4a8[0xd] = 0xff;
    auStackY_4a8[0xe] = 0xff;
    auStackY_4a8[0xf] = 0xff;
    auStackY_4a8[0x10] = 0xff;
    auStackY_4a8[0x11] = 0xff;
    auStackY_4a8[0x12] = 0xff;
    auStackY_4a8[0x13] = 0xff;
    auStackY_4a8[0x14] = 0xff;
    auStackY_4a8[0x15] = 0xff;
    auStackY_4a8[0x16] = 0xff;
    auStackY_4a8[0x17] = 0xff;
    auStackY_4a8[0x18] = 0xff;
    auStackY_4a8[0x19] = 0xff;
    auStackY_4a8[0x1a] = 0xff;
    auStackY_4a8[0x1b] = 0xff;
    auStackY_4a8[0x1c] = 0xff;
    auStackY_4a8[0x1d] = 0xff;
    auStackY_4a8[0x1e] = 0xff;
    auStackY_4a8[0x1f] = 0xff;
    auStackY_4a8[0x20] = 0xff;
    auStackY_4a8[0x21] = 0xff;
    auStackY_4a8[0x22] = 0xff;
    auStackY_4a8[0x23] = 0xff;
    auStackY_4a8[0x24] = 0xff;
    auStackY_4a8[0x25] = 0xff;
    auStackY_4a8[0x26] = 0xff;
    auStackY_4a8[0x27] = 0xff;
    auStackY_4a8[0x28] = 0xff;
    auStackY_4a8[0x29] = 0xff;
    auStackY_4a8[0x2a] = 0xff;
    auStackY_4a8[0x2b] = 0xff;
    auStackY_4a8[0x2c] = 0xff;
    auStackY_4a8[0x2d] = 0xff;
    auStackY_4a8[0x2e] = 0xff;
    auStackY_4a8[0x2f] = 0xff;
    uStackY_328 = 0x4d430001;
    uStackY_318 = 0x40;
    uStackY_310 = 0;
    uStackY_308 = 0;
    uStackY_300 = 0;
    uStackY_470 = 0;
    psStackY_2e8 = (secp256k1_pubkey *)auStackY_368;
    iVar3 = secp256k1_ec_pubkey_combine(CTX,(secp256k1_pubkey *)auStackY_4b8,&psStackY_2f8,3);
    if (iVar3 == 0) goto LAB_0013f8ea;
    uStackY_328 = 0x4d430005;
    uStackY_318 = 0x40;
    lVar10 = 0;
    uStackY_310 = 0;
    uStackY_308 = 0;
    uStackY_300 = 0;
    uStackY_470 = 0;
    do {
      iVar3 = (uint)(byte)auStackY_4b8[lVar10] - (uint)(byte)auStackY_3c8[lVar10];
      if (auStackY_4b8[lVar10] != auStackY_3c8[lVar10]) goto LAB_0013f4e1;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x40);
    iVar3 = 0;
LAB_0013f4e1:
    psStackY_320 = (secp256k1_pubkey *)auStackY_4b8;
    if (iVar3 < 1) goto LAB_0013f8ef;
    if (iStackY_4c4 != 3) goto LAB_0013f8f4;
    sStackY_4c0 = 0x21;
    iVar3 = secp256k1_ec_pubkey_serialize
                      (CTX,abStackY_468,&sStackY_4c0,(secp256k1_pubkey *)auStackY_4b8,0x102);
    if (iVar3 == 0) goto LAB_0013f8f9;
    iVar3 = secp256k1_ec_pubkey_serialize
                      (CTX,abStackY_438,&sStackY_4c0,(secp256k1_pubkey *)auStackY_368,0x102);
    if (iVar3 == 0) goto LAB_0013f8fe;
    lVar10 = 0;
    do {
      iVar3 = (uint)abStackY_468[lVar10] - (uint)abStackY_438[lVar10];
      if (abStackY_468[lVar10] != abStackY_438[lVar10]) goto LAB_0013f581;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x21);
    iVar3 = 0;
LAB_0013f581:
    if (iVar3 != 0) goto LAB_0013f903;
    auStackY_4b8[0] = 0xff;
    auStackY_4b8[1] = 0xff;
    auStackY_4b8[2] = 0xff;
    auStackY_4b8[3] = 0xff;
    auStackY_4b8[4] = 0xff;
    auStackY_4b8[5] = 0xff;
    auStackY_4b8[6] = 0xff;
    auStackY_4b8[7] = 0xff;
    psStackY_4b0 = (secp256k1_pubkey *)0xffffffffffffffff;
    auStackY_4a8[0] = 0xff;
    auStackY_4a8[1] = 0xff;
    auStackY_4a8[2] = 0xff;
    auStackY_4a8[3] = 0xff;
    auStackY_4a8[4] = 0xff;
    auStackY_4a8[5] = 0xff;
    auStackY_4a8[6] = 0xff;
    auStackY_4a8[7] = 0xff;
    auStackY_4a8[8] = 0xff;
    auStackY_4a8[9] = 0xff;
    auStackY_4a8[10] = 0xff;
    auStackY_4a8[0xb] = 0xff;
    auStackY_4a8[0xc] = 0xff;
    auStackY_4a8[0xd] = 0xff;
    auStackY_4a8[0xe] = 0xff;
    auStackY_4a8[0xf] = 0xff;
    auStackY_4a8[0x10] = 0xff;
    auStackY_4a8[0x11] = 0xff;
    auStackY_4a8[0x12] = 0xff;
    auStackY_4a8[0x13] = 0xff;
    auStackY_4a8[0x14] = 0xff;
    auStackY_4a8[0x15] = 0xff;
    auStackY_4a8[0x16] = 0xff;
    auStackY_4a8[0x17] = 0xff;
    auStackY_4a8[0x18] = 0xff;
    auStackY_4a8[0x19] = 0xff;
    auStackY_4a8[0x1a] = 0xff;
    auStackY_4a8[0x1b] = 0xff;
    auStackY_4a8[0x1c] = 0xff;
    auStackY_4a8[0x1d] = 0xff;
    auStackY_4a8[0x1e] = 0xff;
    auStackY_4a8[0x1f] = 0xff;
    auStackY_4a8[0x20] = 0xff;
    auStackY_4a8[0x21] = 0xff;
    auStackY_4a8[0x22] = 0xff;
    auStackY_4a8[0x23] = 0xff;
    auStackY_4a8[0x24] = 0xff;
    auStackY_4a8[0x25] = 0xff;
    auStackY_4a8[0x26] = 0xff;
    auStackY_4a8[0x27] = 0xff;
    auStackY_4a8[0x28] = 0xff;
    auStackY_4a8[0x29] = 0xff;
    auStackY_4a8[0x2a] = 0xff;
    auStackY_4a8[0x2b] = 0xff;
    auStackY_4a8[0x2c] = 0xff;
    auStackY_4a8[0x2d] = 0xff;
    auStackY_4a8[0x2e] = 0xff;
    auStackY_4a8[0x2f] = 0xff;
    uStackY_328 = 0x4d430001;
    uStackY_318 = 0x40;
    uStackY_310 = 0;
    uStackY_308 = 0;
    uStackY_300 = 0;
    uStackY_470 = 0;
    psStackY_320 = (secp256k1_pubkey *)auStackY_4b8;
    psStackY_2f0 = (secp256k1_pubkey *)auStackY_368;
    iVar3 = secp256k1_ec_pubkey_combine(CTX,(secp256k1_pubkey *)auStackY_4b8,&psStackY_2f8,2);
    psVar8 = CTX;
    if (iVar3 == 0) goto LAB_0013f908;
    uStackY_328 = 0x4d430005;
    uStackY_318 = 0x40;
    lVar10 = 0;
    uStackY_310 = 0;
    uStackY_308 = 0;
    uStackY_300 = 0;
    uStackY_470 = 0;
    do {
      iVar3 = (uint)(byte)auStackY_4b8[lVar10] - (uint)(byte)auStackY_3c8[lVar10];
      if (auStackY_4b8[lVar10] != auStackY_3c8[lVar10]) goto LAB_0013f686;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x40);
    iVar3 = 0;
LAB_0013f686:
    psStackY_320 = (secp256k1_pubkey *)auStackY_4b8;
    if (iVar3 < 1) goto LAB_0013f90d;
    if (iStackY_4c4 == 3) {
      if (secp256k1_context_static != CTX) {
        (CTX->illegal_callback).fn = secp256k1_default_illegal_callback_fn;
        (psVar8->illegal_callback).data = (void *)0x0;
        return;
      }
      goto LAB_0013f917;
    }
  }
  else {
    run_eckey_edge_case_test_cold_37();
LAB_0013f7f5:
    run_eckey_edge_case_test_cold_38();
LAB_0013f7fa:
    run_eckey_edge_case_test_cold_39();
LAB_0013f7ff:
    run_eckey_edge_case_test_cold_40();
LAB_0013f804:
    run_eckey_edge_case_test_cold_41();
LAB_0013f809:
    run_eckey_edge_case_test_cold_42();
LAB_0013f80e:
    run_eckey_edge_case_test_cold_43();
LAB_0013f813:
    run_eckey_edge_case_test_cold_95();
LAB_0013f818:
    run_eckey_edge_case_test_cold_44();
LAB_0013f81d:
    run_eckey_edge_case_test_cold_45();
LAB_0013f822:
    run_eckey_edge_case_test_cold_46();
LAB_0013f827:
    run_eckey_edge_case_test_cold_47();
LAB_0013f82c:
    run_eckey_edge_case_test_cold_48();
LAB_0013f831:
    run_eckey_edge_case_test_cold_49();
LAB_0013f836:
    run_eckey_edge_case_test_cold_50();
LAB_0013f83b:
    run_eckey_edge_case_test_cold_51();
LAB_0013f840:
    run_eckey_edge_case_test_cold_52();
LAB_0013f845:
    run_eckey_edge_case_test_cold_53();
LAB_0013f84a:
    run_eckey_edge_case_test_cold_54();
LAB_0013f84f:
    run_eckey_edge_case_test_cold_55();
LAB_0013f854:
    run_eckey_edge_case_test_cold_56();
LAB_0013f859:
    run_eckey_edge_case_test_cold_57();
LAB_0013f85e:
    run_eckey_edge_case_test_cold_58();
LAB_0013f863:
    run_eckey_edge_case_test_cold_59();
LAB_0013f868:
    run_eckey_edge_case_test_cold_60();
LAB_0013f86d:
    run_eckey_edge_case_test_cold_61();
LAB_0013f872:
    run_eckey_edge_case_test_cold_62();
LAB_0013f877:
    run_eckey_edge_case_test_cold_63();
LAB_0013f87c:
    run_eckey_edge_case_test_cold_64();
LAB_0013f881:
    run_eckey_edge_case_test_cold_65();
LAB_0013f886:
    run_eckey_edge_case_test_cold_66();
LAB_0013f88b:
    run_eckey_edge_case_test_cold_67();
LAB_0013f890:
    run_eckey_edge_case_test_cold_68();
LAB_0013f895:
    run_eckey_edge_case_test_cold_69();
LAB_0013f89a:
    run_eckey_edge_case_test_cold_70();
LAB_0013f89f:
    run_eckey_edge_case_test_cold_71();
LAB_0013f8a4:
    run_eckey_edge_case_test_cold_72();
LAB_0013f8a9:
    run_eckey_edge_case_test_cold_73();
LAB_0013f8ae:
    run_eckey_edge_case_test_cold_74();
LAB_0013f8b3:
    run_eckey_edge_case_test_cold_75();
LAB_0013f8b8:
    run_eckey_edge_case_test_cold_76();
LAB_0013f8bd:
    run_eckey_edge_case_test_cold_94();
LAB_0013f8c2:
    run_eckey_edge_case_test_cold_93();
LAB_0013f8c7:
    run_eckey_edge_case_test_cold_77();
LAB_0013f8cc:
    run_eckey_edge_case_test_cold_92();
LAB_0013f8d1:
    run_eckey_edge_case_test_cold_91();
LAB_0013f8d6:
    run_eckey_edge_case_test_cold_78();
LAB_0013f8db:
    run_eckey_edge_case_test_cold_79();
LAB_0013f8e0:
    run_eckey_edge_case_test_cold_80();
LAB_0013f8e5:
    run_eckey_edge_case_test_cold_81();
LAB_0013f8ea:
    run_eckey_edge_case_test_cold_90();
LAB_0013f8ef:
    run_eckey_edge_case_test_cold_89();
LAB_0013f8f4:
    run_eckey_edge_case_test_cold_82();
LAB_0013f8f9:
    run_eckey_edge_case_test_cold_88();
LAB_0013f8fe:
    run_eckey_edge_case_test_cold_87();
LAB_0013f903:
    run_eckey_edge_case_test_cold_83();
LAB_0013f908:
    run_eckey_edge_case_test_cold_86();
LAB_0013f90d:
    run_eckey_edge_case_test_cold_85();
  }
  run_eckey_edge_case_test_cold_84();
  psVar8 = extraout_RAX_08;
LAB_0013f917:
  (*(psVar8->illegal_callback).fn)
            ("ctx != secp256k1_context_static",(psVar8->illegal_callback).data);
  return;
}

Assistant:

static void run_proper_context_tests(int use_prealloc) {
    int32_t dummy = 0;
    secp256k1_context *my_ctx, *my_ctx_fresh;
    void *my_ctx_prealloc = NULL;
    unsigned char seed[32] = {0x17};

    secp256k1_gej pubj;
    secp256k1_ge pub;
    secp256k1_scalar msg, key, nonce;
    secp256k1_scalar sigr, sigs;

    /* Fresh reference context for comparison */
    my_ctx_fresh = secp256k1_context_create(SECP256K1_CONTEXT_NONE);

    if (use_prealloc) {
        my_ctx_prealloc = malloc(secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE));
        CHECK(my_ctx_prealloc != NULL);
        my_ctx = secp256k1_context_preallocated_create(my_ctx_prealloc, SECP256K1_CONTEXT_NONE);
    } else {
        my_ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);
    }

    /* Randomize and reset randomization */
    CHECK(context_eq(my_ctx, my_ctx_fresh));
    CHECK(secp256k1_context_randomize(my_ctx, seed) == 1);
    CHECK(!context_eq(my_ctx, my_ctx_fresh));
    CHECK(secp256k1_context_randomize(my_ctx, NULL) == 1);
    CHECK(context_eq(my_ctx, my_ctx_fresh));

    /* set error callback (to a function that still aborts in case malloc() fails in secp256k1_context_clone() below) */
    secp256k1_context_set_error_callback(my_ctx, secp256k1_default_illegal_callback_fn, NULL);
    CHECK(my_ctx->error_callback.fn != secp256k1_default_error_callback_fn);
    CHECK(my_ctx->error_callback.fn == secp256k1_default_illegal_callback_fn);

    /* check if sizes for cloning are consistent */
    CHECK(secp256k1_context_preallocated_clone_size(my_ctx) == secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE));

    /*** clone and destroy all of them to make sure cloning was complete ***/
    {
        secp256k1_context *ctx_tmp;

        if (use_prealloc) {
            /* clone into a non-preallocated context and then again into a new preallocated one. */
            ctx_tmp = my_ctx;
            my_ctx = secp256k1_context_clone(my_ctx);
            CHECK(context_eq(ctx_tmp, my_ctx));
            secp256k1_context_preallocated_destroy(ctx_tmp);

            free(my_ctx_prealloc);
            my_ctx_prealloc = malloc(secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE));
            CHECK(my_ctx_prealloc != NULL);
            ctx_tmp = my_ctx;
            my_ctx = secp256k1_context_preallocated_clone(my_ctx, my_ctx_prealloc);
            CHECK(context_eq(ctx_tmp, my_ctx));
            secp256k1_context_destroy(ctx_tmp);
        } else {
            /* clone into a preallocated context and then again into a new non-preallocated one. */
            void *prealloc_tmp;

            prealloc_tmp = malloc(secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE));
            CHECK(prealloc_tmp != NULL);
            ctx_tmp = my_ctx;
            my_ctx = secp256k1_context_preallocated_clone(my_ctx, prealloc_tmp);
            CHECK(context_eq(ctx_tmp, my_ctx));
            secp256k1_context_destroy(ctx_tmp);

            ctx_tmp = my_ctx;
            my_ctx = secp256k1_context_clone(my_ctx);
            CHECK(context_eq(ctx_tmp, my_ctx));
            secp256k1_context_preallocated_destroy(ctx_tmp);
            free(prealloc_tmp);
        }
    }

    /* Verify that the error callback makes it across the clone. */
    CHECK(my_ctx->error_callback.fn != secp256k1_default_error_callback_fn);
    CHECK(my_ctx->error_callback.fn == secp256k1_default_illegal_callback_fn);
    /* And that it resets back to default. */
    secp256k1_context_set_error_callback(my_ctx, NULL, NULL);
    CHECK(my_ctx->error_callback.fn == secp256k1_default_error_callback_fn);
    CHECK(context_eq(my_ctx, my_ctx_fresh));

    /* Verify that setting and resetting illegal callback works */
    secp256k1_context_set_illegal_callback(my_ctx, counting_illegal_callback_fn, &dummy);
    CHECK(my_ctx->illegal_callback.fn == counting_illegal_callback_fn);
    CHECK(my_ctx->illegal_callback.data == &dummy);
    secp256k1_context_set_illegal_callback(my_ctx, NULL, NULL);
    CHECK(my_ctx->illegal_callback.fn == secp256k1_default_illegal_callback_fn);
    CHECK(my_ctx->illegal_callback.data == NULL);
    CHECK(context_eq(my_ctx, my_ctx_fresh));

    /*** attempt to use them ***/
    random_scalar_order_test(&msg);
    random_scalar_order_test(&key);
    secp256k1_ecmult_gen(&my_ctx->ecmult_gen_ctx, &pubj, &key);
    secp256k1_ge_set_gej(&pub, &pubj);

    /* obtain a working nonce */
    do {
        random_scalar_order_test(&nonce);
    } while(!secp256k1_ecdsa_sig_sign(&my_ctx->ecmult_gen_ctx, &sigr, &sigs, &key, &msg, &nonce, NULL));

    /* try signing */
    CHECK(secp256k1_ecdsa_sig_sign(&my_ctx->ecmult_gen_ctx, &sigr, &sigs, &key, &msg, &nonce, NULL));

    /* try verifying */
    CHECK(secp256k1_ecdsa_sig_verify(&sigr, &sigs, &pub, &msg));

    /* cleanup */
    if (use_prealloc) {
        secp256k1_context_preallocated_destroy(my_ctx);
        free(my_ctx_prealloc);
    } else {
        secp256k1_context_destroy(my_ctx);
    }
    secp256k1_context_destroy(my_ctx_fresh);

    /* Defined as no-op. */
    secp256k1_context_destroy(NULL);
    secp256k1_context_preallocated_destroy(NULL);
}